

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx2::CurveNvIntersectorK<4,4>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  float *pfVar4;
  uint uVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [32];
  Primitive PVar9;
  uint uVar10;
  int iVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  code *pcVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  ulong uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [28];
  undefined1 auVar83 [28];
  uint uVar84;
  uint uVar85;
  ulong uVar86;
  ulong uVar87;
  long lVar88;
  Primitive *pPVar89;
  long lVar90;
  undefined4 uVar91;
  undefined8 unaff_R14;
  ulong uVar92;
  undefined8 uVar93;
  float fVar113;
  vint4 bi_2;
  undefined1 auVar94 [16];
  float fVar111;
  float fVar115;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar112;
  float fVar114;
  float fVar116;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar98 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined8 uVar120;
  vint4 bi_1;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  float fVar141;
  float fVar142;
  undefined1 auVar143 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  vint4 ai_2;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  vint4 ai;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  vint4 bi;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  vint4 ai_1;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  float fVar198;
  float fVar205;
  float fVar206;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar208;
  float fVar210;
  float fVar212;
  float fVar214;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar207;
  float fVar209;
  float fVar211;
  float fVar213;
  undefined1 auVar204 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined4 uVar220;
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  undefined1 auVar228 [32];
  undefined1 auVar227 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_880 [16];
  undefined1 auStack_870 [16];
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_800 [16];
  undefined1 auStack_7f0 [16];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 (*local_688) [16];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [2] [32];
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_3b0 [16];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  int local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar9 = prim[1];
  uVar86 = (ulong)(byte)PVar9;
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar142 = *(float *)(prim + uVar86 * 0x19 + 0x12);
  auVar15 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + uVar86 * 0x19 + 6));
  auVar94._0_4_ = fVar142 * auVar15._0_4_;
  auVar94._4_4_ = fVar142 * auVar15._4_4_;
  auVar94._8_4_ = fVar142 * auVar15._8_4_;
  auVar94._12_4_ = fVar142 * auVar15._12_4_;
  auVar172._0_4_ = fVar142 * auVar16._0_4_;
  auVar172._4_4_ = fVar142 * auVar16._4_4_;
  auVar172._8_4_ = fVar142 * auVar16._8_4_;
  auVar172._12_4_ = fVar142 * auVar16._12_4_;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 4 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 6 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xb + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xc + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xd + 6)));
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x12 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x13 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x14 + 6)));
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar231._4_4_ = auVar172._0_4_;
  auVar231._0_4_ = auVar172._0_4_;
  auVar231._8_4_ = auVar172._0_4_;
  auVar231._12_4_ = auVar172._0_4_;
  auVar122 = vshufps_avx(auVar172,auVar172,0x55);
  auVar95 = vshufps_avx(auVar172,auVar172,0xaa);
  fVar142 = auVar95._0_4_;
  auVar215._0_4_ = fVar142 * auVar17._0_4_;
  fVar111 = auVar95._4_4_;
  auVar215._4_4_ = fVar111 * auVar17._4_4_;
  fVar113 = auVar95._8_4_;
  auVar215._8_4_ = fVar113 * auVar17._8_4_;
  fVar115 = auVar95._12_4_;
  auVar215._12_4_ = fVar115 * auVar17._12_4_;
  auVar199._0_4_ = auVar161._0_4_ * fVar142;
  auVar199._4_4_ = auVar161._4_4_ * fVar111;
  auVar199._8_4_ = auVar161._8_4_ * fVar113;
  auVar199._12_4_ = auVar161._12_4_ * fVar115;
  auVar190._0_4_ = auVar143._0_4_ * fVar142;
  auVar190._4_4_ = auVar143._4_4_ * fVar111;
  auVar190._8_4_ = auVar143._8_4_ * fVar113;
  auVar190._12_4_ = auVar143._12_4_ * fVar115;
  auVar95 = vfmadd231ps_fma(auVar215,auVar122,auVar16);
  auVar123 = vfmadd231ps_fma(auVar199,auVar122,auVar19);
  auVar122 = vfmadd231ps_fma(auVar190,auVar96,auVar122);
  auVar158 = vfmadd231ps_fma(auVar95,auVar231,auVar15);
  auVar123 = vfmadd231ps_fma(auVar123,auVar231,auVar18);
  auVar166 = vfmadd231ps_fma(auVar122,auVar97,auVar231);
  auVar232._4_4_ = auVar94._0_4_;
  auVar232._0_4_ = auVar94._0_4_;
  auVar232._8_4_ = auVar94._0_4_;
  auVar232._12_4_ = auVar94._0_4_;
  auVar122 = vshufps_avx(auVar94,auVar94,0x55);
  auVar95 = vshufps_avx(auVar94,auVar94,0xaa);
  fVar142 = auVar95._0_4_;
  auVar173._0_4_ = fVar142 * auVar17._0_4_;
  fVar111 = auVar95._4_4_;
  auVar173._4_4_ = fVar111 * auVar17._4_4_;
  fVar113 = auVar95._8_4_;
  auVar173._8_4_ = fVar113 * auVar17._8_4_;
  fVar115 = auVar95._12_4_;
  auVar173._12_4_ = fVar115 * auVar17._12_4_;
  auVar121._0_4_ = auVar161._0_4_ * fVar142;
  auVar121._4_4_ = auVar161._4_4_ * fVar111;
  auVar121._8_4_ = auVar161._8_4_ * fVar113;
  auVar121._12_4_ = auVar161._12_4_ * fVar115;
  auVar95._0_4_ = auVar143._0_4_ * fVar142;
  auVar95._4_4_ = auVar143._4_4_ * fVar111;
  auVar95._8_4_ = auVar143._8_4_ * fVar113;
  auVar95._12_4_ = auVar143._12_4_ * fVar115;
  auVar16 = vfmadd231ps_fma(auVar173,auVar122,auVar16);
  auVar17 = vfmadd231ps_fma(auVar121,auVar122,auVar19);
  auVar19 = vfmadd231ps_fma(auVar95,auVar122,auVar96);
  auVar161 = vfmadd231ps_fma(auVar16,auVar232,auVar15);
  auVar96 = vfmadd231ps_fma(auVar17,auVar232,auVar18);
  auVar143 = vfmadd231ps_fma(auVar19,auVar232,auVar97);
  local_270._8_4_ = 0x7fffffff;
  local_270._0_8_ = 0x7fffffff7fffffff;
  local_270._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx(auVar158,local_270);
  auVar165._8_4_ = 0x219392ef;
  auVar165._0_8_ = 0x219392ef219392ef;
  auVar165._12_4_ = 0x219392ef;
  auVar15 = vcmpps_avx(auVar15,auVar165,1);
  auVar16 = vblendvps_avx(auVar158,auVar165,auVar15);
  auVar15 = vandps_avx(auVar123,local_270);
  auVar15 = vcmpps_avx(auVar15,auVar165,1);
  auVar17 = vblendvps_avx(auVar123,auVar165,auVar15);
  auVar15 = vandps_avx(local_270,auVar166);
  auVar15 = vcmpps_avx(auVar15,auVar165,1);
  auVar15 = vblendvps_avx(auVar166,auVar165,auVar15);
  auVar18 = vrcpps_avx(auVar16);
  auVar191._8_4_ = 0x3f800000;
  auVar191._0_8_ = 0x3f8000003f800000;
  auVar191._12_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar16,auVar18,auVar191);
  auVar18 = vfmadd132ps_fma(auVar16,auVar18,auVar18);
  auVar16 = vrcpps_avx(auVar17);
  auVar17 = vfnmadd213ps_fma(auVar17,auVar16,auVar191);
  auVar19 = vfmadd132ps_fma(auVar17,auVar16,auVar16);
  auVar16 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar16,auVar191);
  auVar97 = vfmadd132ps_fma(auVar15,auVar16,auVar16);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar86 * 7 + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar161);
  auVar166._0_4_ = auVar18._0_4_ * auVar15._0_4_;
  auVar166._4_4_ = auVar18._4_4_ * auVar15._4_4_;
  auVar166._8_4_ = auVar18._8_4_ * auVar15._8_4_;
  auVar166._12_4_ = auVar18._12_4_ * auVar15._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar86 * 9 + 6);
  auVar15 = vpmovsxwd_avx(auVar16);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar161);
  auVar174._0_4_ = auVar18._0_4_ * auVar15._0_4_;
  auVar174._4_4_ = auVar18._4_4_ * auVar15._4_4_;
  auVar174._8_4_ = auVar18._8_4_ * auVar15._8_4_;
  auVar174._12_4_ = auVar18._12_4_ * auVar15._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar86 * 0xe + 6);
  auVar15 = vpmovsxwd_avx(auVar17);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar96);
  auVar183._0_4_ = auVar19._0_4_ * auVar15._0_4_;
  auVar183._4_4_ = auVar19._4_4_ * auVar15._4_4_;
  auVar183._8_4_ = auVar19._8_4_ * auVar15._8_4_;
  auVar183._12_4_ = auVar19._12_4_ * auVar15._12_4_;
  auVar123._1_3_ = 0;
  auVar123[0] = PVar9;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar15 = vpmovsxwd_avx(auVar18);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar96);
  auVar122._0_4_ = auVar19._0_4_ * auVar15._0_4_;
  auVar122._4_4_ = auVar19._4_4_ * auVar15._4_4_;
  auVar122._8_4_ = auVar19._8_4_ * auVar15._8_4_;
  auVar122._12_4_ = auVar19._12_4_ * auVar15._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar86 * 0x15 + 6);
  auVar15 = vpmovsxwd_avx(auVar19);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar143);
  auVar158._0_4_ = auVar97._0_4_ * auVar15._0_4_;
  auVar158._4_4_ = auVar97._4_4_ * auVar15._4_4_;
  auVar158._8_4_ = auVar97._8_4_ * auVar15._8_4_;
  auVar158._12_4_ = auVar97._12_4_ * auVar15._12_4_;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar86 * 0x17 + 6);
  auVar15 = vpmovsxwd_avx(auVar161);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar143);
  auVar96._0_4_ = auVar97._0_4_ * auVar15._0_4_;
  auVar96._4_4_ = auVar97._4_4_ * auVar15._4_4_;
  auVar96._8_4_ = auVar97._8_4_ * auVar15._8_4_;
  auVar96._12_4_ = auVar97._12_4_ * auVar15._12_4_;
  auVar15 = vpminsd_avx(auVar166,auVar174);
  auVar16 = vpminsd_avx(auVar183,auVar122);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vpminsd_avx(auVar158,auVar96);
  uVar91 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar200._4_4_ = uVar91;
  auVar200._0_4_ = uVar91;
  auVar200._8_4_ = uVar91;
  auVar200._12_4_ = uVar91;
  auVar16 = vmaxps_avx(auVar16,auVar200);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  local_280._0_4_ = auVar15._0_4_ * 0.99999964;
  local_280._4_4_ = auVar15._4_4_ * 0.99999964;
  local_280._8_4_ = auVar15._8_4_ * 0.99999964;
  local_280._12_4_ = auVar15._12_4_ * 0.99999964;
  auVar15 = vpmaxsd_avx(auVar166,auVar174);
  auVar16 = vpmaxsd_avx(auVar183,auVar122);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar16 = vpmaxsd_avx(auVar158,auVar96);
  uVar91 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar143._4_4_ = uVar91;
  auVar143._0_4_ = uVar91;
  auVar143._8_4_ = uVar91;
  auVar143._12_4_ = uVar91;
  auVar16 = vminps_avx(auVar16,auVar143);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar97._0_4_ = auVar15._0_4_ * 1.0000004;
  auVar97._4_4_ = auVar15._4_4_ * 1.0000004;
  auVar97._8_4_ = auVar15._8_4_ * 1.0000004;
  auVar97._12_4_ = auVar15._12_4_ * 1.0000004;
  auVar123[4] = PVar9;
  auVar123._5_3_ = 0;
  auVar123[8] = PVar9;
  auVar123._9_3_ = 0;
  auVar123[0xc] = PVar9;
  auVar123._13_3_ = 0;
  auVar16 = vpcmpgtd_avx(auVar123,_DAT_01f4ad30);
  auVar15 = vcmpps_avx(local_280,auVar97,2);
  auVar15 = vandps_avx(auVar15,auVar16);
  uVar91 = vmovmskps_avx(auVar15);
  uVar92 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar91);
  local_540[1]._0_8_ = mm_lookupmask_ps._16_8_;
  local_540[1]._8_8_ = mm_lookupmask_ps._24_8_;
  local_540[1]._16_8_ = mm_lookupmask_ps._16_8_;
  local_540[1]._24_8_ = mm_lookupmask_ps._24_8_;
  local_688 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  pPVar89 = prim + uVar86 * 0x19 + 0x16;
  do {
    auVar101 = local_460;
    if (uVar92 == 0) {
      return;
    }
    lVar88 = 0;
    for (uVar86 = uVar92; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
      lVar88 = lVar88 + 1;
    }
    uVar92 = uVar92 - 1 & uVar92;
    uVar84 = *(uint *)(prim + lVar88 * 4 + 6);
    uVar86 = (ulong)(uint)((int)lVar88 << 6);
    uVar10 = *(uint *)(prim + 2);
    pGVar12 = (context->scene->geometries).items[uVar10].ptr;
    pPVar1 = pPVar89 + uVar86;
    uVar79 = *(undefined8 *)pPVar1;
    uVar80 = *(undefined8 *)(pPVar1 + 8);
    auVar17 = *(undefined1 (*) [16])pPVar1;
    auVar16 = *(undefined1 (*) [16])pPVar1;
    auVar15 = *(undefined1 (*) [16])pPVar1;
    if (uVar92 != 0) {
      uVar87 = uVar92 - 1 & uVar92;
      for (uVar21 = uVar92; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
      }
      if (uVar87 != 0) {
        for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar18 = *(undefined1 (*) [16])(pPVar89 + uVar86 + 0x10);
    auVar19 = *(undefined1 (*) [16])(pPVar89 + uVar86 + 0x20);
    auVar161 = *(undefined1 (*) [16])(pPVar89 + uVar86 + 0x30);
    iVar11 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar97 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar122 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar96 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar122);
    uVar91 = auVar96._0_4_;
    auVar167._4_4_ = uVar91;
    auVar167._0_4_ = uVar91;
    auVar167._8_4_ = uVar91;
    auVar167._12_4_ = uVar91;
    auVar97 = vshufps_avx(auVar96,auVar96,0x55);
    auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
    aVar6 = pre->ray_space[k].vx.field_0;
    aVar7 = pre->ray_space[k].vy.field_0;
    fVar142 = pre->ray_space[k].vz.field_0.m128[0];
    fVar111 = pre->ray_space[k].vz.field_0.m128[1];
    fVar113 = pre->ray_space[k].vz.field_0.m128[2];
    fVar115 = pre->ray_space[k].vz.field_0.m128[3];
    auVar184._0_4_ = fVar142 * auVar96._0_4_;
    auVar184._4_4_ = fVar111 * auVar96._4_4_;
    auVar184._8_4_ = fVar113 * auVar96._8_4_;
    auVar184._12_4_ = fVar115 * auVar96._12_4_;
    auVar97 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar7,auVar97);
    auVar123 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar6,auVar167);
    auVar97 = vblendps_avx(auVar123,*(undefined1 (*) [16])pPVar1,8);
    auVar143 = vsubps_avx(auVar18,auVar122);
    uVar91 = auVar143._0_4_;
    auVar185._4_4_ = uVar91;
    auVar185._0_4_ = uVar91;
    auVar185._8_4_ = uVar91;
    auVar185._12_4_ = uVar91;
    auVar96 = vshufps_avx(auVar143,auVar143,0x55);
    auVar143 = vshufps_avx(auVar143,auVar143,0xaa);
    auVar216._0_4_ = fVar142 * auVar143._0_4_;
    auVar216._4_4_ = fVar111 * auVar143._4_4_;
    auVar216._8_4_ = fVar113 * auVar143._8_4_;
    auVar216._12_4_ = fVar115 * auVar143._12_4_;
    auVar96 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar7,auVar96);
    auVar158 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar6,auVar185);
    auVar96 = vblendps_avx(auVar158,auVar18,8);
    auVar95 = vsubps_avx(auVar19,auVar122);
    uVar91 = auVar95._0_4_;
    auVar192._4_4_ = uVar91;
    auVar192._0_4_ = uVar91;
    auVar192._8_4_ = uVar91;
    auVar192._12_4_ = uVar91;
    auVar143 = vshufps_avx(auVar95,auVar95,0x55);
    auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
    auVar221._0_4_ = fVar142 * auVar95._0_4_;
    auVar221._4_4_ = fVar111 * auVar95._4_4_;
    auVar221._8_4_ = fVar113 * auVar95._8_4_;
    auVar221._12_4_ = fVar115 * auVar95._12_4_;
    auVar143 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar7,auVar143);
    auVar166 = vfmadd231ps_fma(auVar143,(undefined1  [16])aVar6,auVar192);
    auVar143 = vblendps_avx(auVar166,auVar19,8);
    auVar95 = vsubps_avx(auVar161,auVar122);
    uVar91 = auVar95._0_4_;
    auVar193._4_4_ = uVar91;
    auVar193._0_4_ = uVar91;
    auVar193._8_4_ = uVar91;
    auVar193._12_4_ = uVar91;
    auVar122 = vshufps_avx(auVar95,auVar95,0x55);
    auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
    auVar223._0_4_ = fVar142 * auVar95._0_4_;
    auVar223._4_4_ = fVar111 * auVar95._4_4_;
    auVar223._8_4_ = fVar113 * auVar95._8_4_;
    auVar223._12_4_ = fVar115 * auVar95._12_4_;
    auVar122 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar7,auVar122);
    auVar94 = vfmadd231ps_fma(auVar122,(undefined1  [16])aVar6,auVar193);
    auVar122 = vblendps_avx(auVar94,auVar161,8);
    auVar97 = vandps_avx(auVar97,local_270);
    auVar96 = vandps_avx(auVar96,local_270);
    auVar95 = vmaxps_avx(auVar97,auVar96);
    auVar97 = vandps_avx(auVar143,local_270);
    auVar96 = vandps_avx(auVar122,local_270);
    auVar97 = vmaxps_avx(auVar97,auVar96);
    auVar97 = vmaxps_avx(auVar95,auVar97);
    auVar96 = vmovshdup_avx(auVar97);
    auVar96 = vmaxss_avx(auVar96,auVar97);
    auVar97 = vshufpd_avx(auVar97,auVar97,1);
    auVar97 = vmaxss_avx(auVar97,auVar96);
    lVar88 = (long)iVar11 * 0x44;
    auVar96 = vmovshdup_avx(auVar123);
    uVar93 = auVar96._0_8_;
    local_440._8_8_ = uVar93;
    local_440._0_8_ = uVar93;
    local_440._16_8_ = uVar93;
    local_440._24_8_ = uVar93;
    auVar143 = vmovshdup_avx(auVar158);
    uVar93 = auVar143._0_8_;
    local_4a0._8_8_ = uVar93;
    local_4a0._0_8_ = uVar93;
    local_4a0._16_8_ = uVar93;
    local_4a0._24_8_ = uVar93;
    auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 + 0x908);
    uVar220 = auVar166._0_4_;
    local_560._4_4_ = uVar220;
    local_560._0_4_ = uVar220;
    local_560._8_4_ = uVar220;
    local_560._12_4_ = uVar220;
    local_560._16_4_ = uVar220;
    local_560._20_4_ = uVar220;
    local_560._24_4_ = uVar220;
    local_560._28_4_ = uVar220;
    auVar143 = vmovshdup_avx(auVar166);
    uVar93 = auVar143._0_8_;
    local_720._8_8_ = uVar93;
    local_720._0_8_ = uVar93;
    local_720._16_8_ = uVar93;
    local_720._24_8_ = uVar93;
    fVar142 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar88 + 0xd8c);
    auVar82 = *(undefined1 (*) [28])(bezier_basis0 + lVar88 + 0xd8c);
    local_600 = auVar94._0_4_;
    auVar143 = vmovshdup_avx(auVar94);
    uVar93 = auVar143._0_8_;
    auVar8._4_4_ = local_600 * *(float *)(bezier_basis0 + lVar88 + 0xd90);
    auVar8._0_4_ = local_600 * fVar142;
    auVar8._8_4_ = local_600 * *(float *)(bezier_basis0 + lVar88 + 0xd94);
    auVar8._12_4_ = local_600 * *(float *)(bezier_basis0 + lVar88 + 0xd98);
    auVar8._16_4_ = local_600 * *(float *)(bezier_basis0 + lVar88 + 0xd9c);
    auVar8._20_4_ = local_600 * *(float *)(bezier_basis0 + lVar88 + 0xda0);
    auVar8._24_4_ = local_600 * *(float *)(bezier_basis0 + lVar88 + 0xda4);
    auVar8._28_4_ = *(undefined4 *)(bezier_basis0 + lVar88 + 0xda8);
    auVar122 = vfmadd231ps_fma(auVar8,auVar110,local_560);
    local_640 = auVar143._0_4_;
    auVar107._0_4_ = local_640 * fVar142;
    fStack_63c = auVar143._4_4_;
    auVar107._4_4_ = fStack_63c * *(float *)(bezier_basis0 + lVar88 + 0xd90);
    auVar107._8_4_ = local_640 * *(float *)(bezier_basis0 + lVar88 + 0xd94);
    auVar107._12_4_ = fStack_63c * *(float *)(bezier_basis0 + lVar88 + 0xd98);
    auVar107._16_4_ = local_640 * *(float *)(bezier_basis0 + lVar88 + 0xd9c);
    auVar107._20_4_ = fStack_63c * *(float *)(bezier_basis0 + lVar88 + 0xda0);
    auVar107._24_4_ = local_640 * *(float *)(bezier_basis0 + lVar88 + 0xda4);
    auVar107._28_4_ = 0;
    auVar143 = vfmadd231ps_fma(auVar107,auVar110,local_720);
    auVar8 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 + 0x484);
    uVar91 = auVar158._0_4_;
    local_5e0._4_4_ = uVar91;
    local_5e0._0_4_ = uVar91;
    local_5e0._8_4_ = uVar91;
    local_5e0._12_4_ = uVar91;
    local_5e0._16_4_ = uVar91;
    local_5e0._20_4_ = uVar91;
    local_5e0._24_4_ = uVar91;
    local_5e0._28_4_ = uVar91;
    auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar8,local_5e0);
    auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar8,local_4a0);
    auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar88);
    local_780._0_4_ = auVar123._0_4_;
    local_7a0._4_4_ = local_780._0_4_;
    local_7a0._0_4_ = local_780._0_4_;
    local_7a0._8_4_ = local_780._0_4_;
    local_7a0._12_4_ = local_780._0_4_;
    local_7a0._16_4_ = local_780._0_4_;
    local_7a0._20_4_ = local_780._0_4_;
    local_7a0._24_4_ = local_780._0_4_;
    local_7a0._28_4_ = local_780._0_4_;
    auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar107,local_7a0);
    auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar107,local_440);
    auVar155 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 + 0x908);
    fVar142 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar88 + 0xd8c);
    fVar111 = *(float *)(bezier_basis1 + lVar88 + 0xd90);
    fVar113 = *(float *)(bezier_basis1 + lVar88 + 0xd94);
    fVar115 = *(float *)(bezier_basis1 + lVar88 + 0xd98);
    fVar69 = *(float *)(bezier_basis1 + lVar88 + 0xd9c);
    fVar141 = *(float *)(bezier_basis1 + lVar88 + 0xda0);
    fVar112 = *(float *)(bezier_basis1 + lVar88 + 0xda4);
    auVar83 = *(undefined1 (*) [28])(bezier_basis1 + lVar88 + 0xd8c);
    auVar105._4_4_ = local_600 * fVar111;
    auVar105._0_4_ = local_600 * fVar142;
    auVar105._8_4_ = local_600 * fVar113;
    auVar105._12_4_ = local_600 * fVar115;
    auVar105._16_4_ = local_600 * fVar69;
    auVar105._20_4_ = local_600 * fVar141;
    auVar105._24_4_ = local_600 * fVar112;
    auVar105._28_4_ = *(undefined4 *)(bezier_basis0 + lVar88 + 0xda8);
    auVar95 = vfmadd231ps_fma(auVar105,auVar155,local_560);
    auVar131._4_4_ = fStack_63c * fVar111;
    auVar131._0_4_ = local_640 * fVar142;
    auVar131._8_4_ = local_640 * fVar113;
    auVar131._12_4_ = fStack_63c * fVar115;
    auVar131._16_4_ = local_640 * fVar69;
    auVar131._20_4_ = fStack_63c * fVar141;
    auVar131._24_4_ = local_640 * fVar112;
    auVar131._28_4_ = uVar220;
    auVar121 = vfmadd231ps_fma(auVar131,auVar155,local_720);
    auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 + 0x484);
    auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar105,local_5e0);
    auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar105,local_4a0);
    auVar131 = *(undefined1 (*) [32])(bezier_basis1 + lVar88);
    auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar131,local_7a0);
    auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar131,local_440);
    auVar99 = ZEXT1632(auVar95);
    auVar126 = ZEXT1632(auVar122);
    _local_320 = vsubps_avx(auVar99,auVar126);
    local_2c0 = ZEXT1632(auVar121);
    _local_2e0 = ZEXT1632(auVar143);
    auVar20 = vsubps_avx(local_2c0,_local_2e0);
    auVar100._0_4_ = auVar143._0_4_ * local_320._0_4_;
    auVar100._4_4_ = auVar143._4_4_ * local_320._4_4_;
    auVar100._8_4_ = auVar143._8_4_ * local_320._8_4_;
    auVar100._12_4_ = auVar143._12_4_ * local_320._12_4_;
    auVar100._16_4_ = local_320._16_4_ * 0.0;
    auVar100._20_4_ = local_320._20_4_ * 0.0;
    auVar100._24_4_ = local_320._24_4_ * 0.0;
    auVar100._28_4_ = 0;
    fVar117 = auVar20._0_4_;
    auVar127._0_4_ = fVar117 * auVar122._0_4_;
    fVar118 = auVar20._4_4_;
    auVar127._4_4_ = fVar118 * auVar122._4_4_;
    fVar119 = auVar20._8_4_;
    auVar127._8_4_ = fVar119 * auVar122._8_4_;
    fVar207 = auVar20._12_4_;
    auVar127._12_4_ = fVar207 * auVar122._12_4_;
    fVar209 = auVar20._16_4_;
    auVar127._16_4_ = fVar209 * 0.0;
    fVar211 = auVar20._20_4_;
    auVar127._20_4_ = fVar211 * 0.0;
    fVar213 = auVar20._24_4_;
    auVar127._24_4_ = fVar213 * 0.0;
    auVar127._28_4_ = 0;
    auVar100 = vsubps_avx(auVar100,auVar127);
    auVar143 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
    uVar120 = auVar143._0_8_;
    local_80._8_8_ = uVar120;
    local_80._0_8_ = uVar120;
    local_80._16_8_ = uVar120;
    local_80._24_8_ = uVar120;
    auVar122 = vpermilps_avx(auVar18,0xff);
    uVar120 = auVar122._0_8_;
    local_a0._8_8_ = uVar120;
    local_a0._0_8_ = uVar120;
    local_a0._16_8_ = uVar120;
    local_a0._24_8_ = uVar120;
    auVar122 = vpermilps_avx(auVar19,0xff);
    uVar120 = auVar122._0_8_;
    local_c0._8_8_ = uVar120;
    local_c0._0_8_ = uVar120;
    local_c0._16_8_ = uVar120;
    local_c0._24_8_ = uVar120;
    auVar122 = vpermilps_avx(auVar161,0xff);
    local_e0 = auVar122._0_8_;
    local_860 = auVar82._0_4_;
    fStack_85c = auVar82._4_4_;
    fStack_858 = auVar82._8_4_;
    fStack_854 = auVar82._12_4_;
    fStack_850 = auVar82._16_4_;
    fStack_84c = auVar82._20_4_;
    fStack_848 = auVar82._24_4_;
    fVar114 = auVar122._0_4_;
    fVar116 = auVar122._4_4_;
    auVar106._4_4_ = fVar116 * fStack_85c;
    auVar106._0_4_ = fVar114 * local_860;
    auVar106._8_4_ = fVar114 * fStack_858;
    auVar106._12_4_ = fVar116 * fStack_854;
    auVar106._16_4_ = fVar114 * fStack_850;
    auVar106._20_4_ = fVar116 * fStack_84c;
    auVar106._24_4_ = fVar114 * fStack_848;
    auVar106._28_4_ = auVar96._4_4_;
    auVar96 = vfmadd231ps_fma(auVar106,local_c0,auVar110);
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar8,local_a0);
    auVar122 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar107,local_80);
    auVar189 = ZEXT1664(auVar122);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    auVar135._4_4_ = fVar111 * fVar116;
    auVar135._0_4_ = fVar142 * fVar114;
    auVar135._8_4_ = fVar113 * fVar114;
    auVar135._12_4_ = fVar115 * fVar116;
    auVar135._16_4_ = fVar69 * fVar114;
    auVar135._20_4_ = fVar141 * fVar116;
    auVar135._24_4_ = fVar112 * fVar114;
    auVar135._28_4_ = auVar107._28_4_;
    auVar96 = vfmadd231ps_fma(auVar135,auVar155,local_c0);
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar105,local_a0);
    auVar95 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar131,local_80);
    auVar154._4_4_ = fVar118 * fVar118;
    auVar154._0_4_ = fVar117 * fVar117;
    auVar154._8_4_ = fVar119 * fVar119;
    auVar154._12_4_ = fVar207 * fVar207;
    auVar154._16_4_ = fVar209 * fVar209;
    auVar154._20_4_ = fVar211 * fVar211;
    auVar154._24_4_ = fVar213 * fVar213;
    auVar154._28_4_ = auVar143._4_4_;
    auVar96 = vfmadd231ps_fma(auVar154,_local_320,_local_320);
    auVar106 = vmaxps_avx(ZEXT1632(auVar122),ZEXT1632(auVar95));
    auVar187._4_4_ = auVar106._4_4_ * auVar106._4_4_ * auVar96._4_4_;
    auVar187._0_4_ = auVar106._0_4_ * auVar106._0_4_ * auVar96._0_4_;
    auVar187._8_4_ = auVar106._8_4_ * auVar106._8_4_ * auVar96._8_4_;
    auVar187._12_4_ = auVar106._12_4_ * auVar106._12_4_ * auVar96._12_4_;
    auVar187._16_4_ = auVar106._16_4_ * auVar106._16_4_ * 0.0;
    auVar187._20_4_ = auVar106._20_4_ * auVar106._20_4_ * 0.0;
    auVar187._24_4_ = auVar106._24_4_ * auVar106._24_4_ * 0.0;
    auVar187._28_4_ = auVar106._28_4_;
    auVar228._4_4_ = auVar100._4_4_ * auVar100._4_4_;
    auVar228._0_4_ = auVar100._0_4_ * auVar100._0_4_;
    auVar228._8_4_ = auVar100._8_4_ * auVar100._8_4_;
    auVar228._12_4_ = auVar100._12_4_ * auVar100._12_4_;
    auVar228._16_4_ = auVar100._16_4_ * auVar100._16_4_;
    auVar228._20_4_ = auVar100._20_4_ * auVar100._20_4_;
    auVar228._24_4_ = auVar100._24_4_ * auVar100._24_4_;
    auVar228._28_4_ = auVar100._28_4_;
    local_460._0_4_ = (undefined4)iVar11;
    local_460._4_12_ = auVar94._4_12_;
    auVar106 = vcmpps_avx(auVar228,auVar187,2);
    fVar142 = auVar97._0_4_ * 4.7683716e-07;
    local_460._16_16_ = auVar101._16_16_;
    auVar101._4_4_ = local_460._0_4_;
    auVar101._0_4_ = local_460._0_4_;
    auVar101._8_4_ = local_460._0_4_;
    auVar101._12_4_ = local_460._0_4_;
    auVar101._16_4_ = local_460._0_4_;
    auVar101._20_4_ = local_460._0_4_;
    auVar101._24_4_ = local_460._0_4_;
    auVar101._28_4_ = local_460._0_4_;
    auVar101 = vcmpps_avx(_DAT_01f7b060,auVar101,1);
    auVar97 = vpermilps_avx(auVar123,0xaa);
    uVar120 = auVar97._0_8_;
    auVar222._8_8_ = uVar120;
    auVar222._0_8_ = uVar120;
    auVar222._16_8_ = uVar120;
    auVar222._24_8_ = uVar120;
    auVar96 = vpermilps_avx(auVar158,0xaa);
    uVar120 = auVar96._0_8_;
    local_6c0._8_8_ = uVar120;
    local_6c0._0_8_ = uVar120;
    local_6c0._16_8_ = uVar120;
    local_6c0._24_8_ = uVar120;
    auVar229 = ZEXT3264(local_6c0);
    auVar143 = vpermilps_avx(auVar166,0xaa);
    uVar120 = auVar143._0_8_;
    auVar217._8_8_ = uVar120;
    auVar217._0_8_ = uVar120;
    auVar217._16_8_ = uVar120;
    auVar217._24_8_ = uVar120;
    auVar97 = vshufps_avx(auVar94,auVar94,0xaa);
    uVar120 = auVar97._0_8_;
    register0x00001508 = uVar120;
    local_6e0 = uVar120;
    register0x00001510 = uVar120;
    register0x00001518 = uVar120;
    auVar226 = ZEXT3264(_local_6e0);
    auVar100 = auVar101 & auVar106;
    uVar5 = *(uint *)(ray + k * 4 + 0x30);
    local_680._0_16_ = ZEXT416(uVar5);
    local_4c0._0_16_ = ZEXT416(uVar10);
    local_480._0_16_ = ZEXT416(uVar84);
    local_7c0 = auVar18._0_8_;
    uStack_7b8 = auVar18._8_8_;
    local_7d0 = auVar19._0_8_;
    uStack_7c8 = auVar19._8_8_;
    local_7e0._0_4_ = auVar161._0_4_;
    fVar111 = (float)local_7e0;
    local_7e0._4_4_ = auVar161._4_4_;
    fVar113 = local_7e0._4_4_;
    uStack_7d8._0_4_ = auVar161._8_4_;
    fVar115 = (float)uStack_7d8;
    uStack_7d8._4_4_ = auVar161._12_4_;
    fVar69 = uStack_7d8._4_4_;
    local_7e0 = auVar161._0_8_;
    uStack_7d8 = auVar161._8_8_;
    fStack_638 = local_640;
    fStack_634 = fStack_63c;
    fStack_630 = local_640;
    fStack_62c = fStack_63c;
    fStack_628 = local_640;
    fStack_624 = fStack_63c;
    fStack_5fc = local_600;
    fStack_5f8 = local_600;
    fStack_5f4 = local_600;
    fStack_5f0 = local_600;
    fStack_5ec = local_600;
    fStack_5e8 = local_600;
    fStack_5e4 = local_600;
    if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar100 >> 0x7f,0) == '\0') &&
          (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar100 >> 0xbf,0) == '\0') &&
        (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar100[0x1f])
    {
      auVar140 = ZEXT3264(local_660);
      auVar164 = ZEXT3264(local_560);
      auVar197 = ZEXT3264(local_720);
      auVar204 = ZEXT3264(CONCAT428(fStack_63c,
                                    CONCAT424(local_640,
                                              CONCAT420(fStack_63c,
                                                        CONCAT416(local_640,
                                                                  CONCAT412(fStack_63c,
                                                                            CONCAT48(local_640,
                                                                                     uVar93)))))));
      auVar157 = ZEXT3264(local_5e0);
      auVar235 = ZEXT3264(local_7a0);
    }
    else {
      local_500 = SUB84(pGVar12,0);
      uStack_4fc = (undefined4)((ulong)pGVar12 >> 0x20);
      local_300 = vandps_avx(auVar106,auVar101);
      local_5c0._0_4_ = auVar83._0_4_;
      local_5c0._4_4_ = auVar83._4_4_;
      fStack_5b8 = auVar83._8_4_;
      fStack_5b4 = auVar83._12_4_;
      fStack_5b0 = auVar83._16_4_;
      fStack_5ac = auVar83._20_4_;
      fStack_5a8 = auVar83._24_4_;
      fVar207 = auVar97._0_4_;
      fVar209 = auVar97._4_4_;
      auVar194._4_4_ = fVar209 * (float)local_5c0._4_4_;
      auVar194._0_4_ = fVar207 * (float)local_5c0._0_4_;
      auVar194._8_4_ = fVar207 * fStack_5b8;
      auVar194._12_4_ = fVar209 * fStack_5b4;
      auVar194._16_4_ = fVar207 * fStack_5b0;
      auVar194._20_4_ = fVar209 * fStack_5ac;
      auVar194._24_4_ = fVar207 * fStack_5a8;
      auVar194._28_4_ = local_300._28_4_;
      auVar161 = vfmadd213ps_fma(auVar155,auVar217,auVar194);
      auVar161 = vfmadd213ps_fma(auVar105,local_6c0,ZEXT1632(auVar161));
      auVar161 = vfmadd213ps_fma(auVar131,auVar222,ZEXT1632(auVar161));
      _local_5c0 = ZEXT1632(auVar161);
      auVar155._4_4_ = fVar209 * fStack_85c;
      auVar155._0_4_ = fVar207 * local_860;
      auVar155._8_4_ = fVar207 * fStack_858;
      auVar155._12_4_ = fVar209 * fStack_854;
      auVar155._16_4_ = fVar207 * fStack_850;
      auVar155._20_4_ = fVar209 * fStack_84c;
      auVar155._24_4_ = fVar207 * fStack_848;
      auVar155._28_4_ = local_300._28_4_;
      auVar161 = vfmadd213ps_fma(auVar110,auVar217,auVar155);
      auVar161 = vfmadd213ps_fma(auVar8,local_6c0,ZEXT1632(auVar161));
      auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 + 0x1210);
      auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 + 0x1694);
      auVar8 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 + 0x1b18);
      fVar141 = *(float *)(bezier_basis0 + lVar88 + 0x1f9c);
      fVar112 = *(float *)(bezier_basis0 + lVar88 + 0x1fa0);
      fVar114 = *(float *)(bezier_basis0 + lVar88 + 0x1fa4);
      fVar116 = *(float *)(bezier_basis0 + lVar88 + 0x1fa8);
      fVar117 = *(float *)(bezier_basis0 + lVar88 + 0x1fac);
      fVar118 = *(float *)(bezier_basis0 + lVar88 + 0x1fb0);
      fVar119 = *(float *)(bezier_basis0 + lVar88 + 0x1fb4);
      auVar179._0_4_ = local_600 * fVar141;
      auVar179._4_4_ = local_600 * fVar112;
      auVar179._8_4_ = local_600 * fVar114;
      auVar179._12_4_ = local_600 * fVar116;
      auVar179._16_4_ = local_600 * fVar117;
      auVar179._20_4_ = local_600 * fVar118;
      auVar179._24_4_ = local_600 * fVar119;
      auVar179._28_4_ = 0;
      auVar195._0_4_ = local_640 * fVar141;
      auVar195._4_4_ = fStack_63c * fVar112;
      auVar195._8_4_ = local_640 * fVar114;
      auVar195._12_4_ = fStack_63c * fVar116;
      auVar195._16_4_ = local_640 * fVar117;
      auVar195._20_4_ = fStack_63c * fVar118;
      auVar195._24_4_ = local_640 * fVar119;
      auVar195._28_4_ = 0;
      auVar22._4_4_ = fVar112 * fVar209;
      auVar22._0_4_ = fVar141 * fVar207;
      auVar22._8_4_ = fVar114 * fVar207;
      auVar22._12_4_ = fVar116 * fVar209;
      auVar22._16_4_ = fVar117 * fVar207;
      auVar22._20_4_ = fVar118 * fVar209;
      auVar22._24_4_ = fVar119 * fVar207;
      auVar22._28_4_ = auVar143._4_4_;
      auVar97 = vfmadd231ps_fma(auVar179,auVar8,local_560);
      auVar143 = vfmadd231ps_fma(auVar195,auVar8,local_720);
      auVar123 = vfmadd231ps_fma(auVar22,auVar217,auVar8);
      auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar110,local_5e0);
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar110,local_4a0);
      auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),local_6c0,auVar110);
      auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar101,local_7a0);
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar101,local_440);
      auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar101,auVar222);
      fVar141 = *(float *)(bezier_basis1 + lVar88 + 0x1f9c);
      fVar112 = *(float *)(bezier_basis1 + lVar88 + 0x1fa0);
      fVar114 = *(float *)(bezier_basis1 + lVar88 + 0x1fa4);
      fVar116 = *(float *)(bezier_basis1 + lVar88 + 0x1fa8);
      fVar117 = *(float *)(bezier_basis1 + lVar88 + 0x1fac);
      fVar118 = *(float *)(bezier_basis1 + lVar88 + 0x1fb0);
      fVar119 = *(float *)(bezier_basis1 + lVar88 + 0x1fb4);
      auVar110._4_4_ = local_600 * fVar112;
      auVar110._0_4_ = local_600 * fVar141;
      auVar110._8_4_ = local_600 * fVar114;
      auVar110._12_4_ = local_600 * fVar116;
      auVar110._16_4_ = local_600 * fVar117;
      auVar110._20_4_ = local_600 * fVar118;
      auVar110._24_4_ = local_600 * fVar119;
      auVar110._28_4_ = local_600;
      auVar23._4_4_ = fStack_63c * fVar112;
      auVar23._0_4_ = local_640 * fVar141;
      auVar23._8_4_ = local_640 * fVar114;
      auVar23._12_4_ = fStack_63c * fVar116;
      auVar23._16_4_ = local_640 * fVar117;
      auVar23._20_4_ = fStack_63c * fVar118;
      auVar23._24_4_ = local_640 * fVar119;
      auVar23._28_4_ = fStack_63c;
      auVar24._4_4_ = fVar112 * fVar209;
      auVar24._0_4_ = fVar141 * fVar207;
      auVar24._8_4_ = fVar114 * fVar207;
      auVar24._12_4_ = fVar116 * fVar209;
      auVar24._16_4_ = fVar117 * fVar207;
      auVar24._20_4_ = fVar118 * fVar209;
      auVar24._24_4_ = fVar119 * fVar207;
      auVar24._28_4_ = auVar96._4_4_;
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 + 0x1b18);
      auVar96 = vfmadd231ps_fma(auVar110,auVar101,local_560);
      auVar158 = vfmadd231ps_fma(auVar23,auVar101,local_720);
      auVar166 = vfmadd231ps_fma(auVar24,auVar217,auVar101);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 + 0x1694);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar101,local_5e0);
      auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar101,local_4a0);
      auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar101,local_6c0);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 + 0x1210);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar101,local_7a0);
      auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar101,local_440);
      auVar128._8_4_ = 0x7fffffff;
      auVar128._0_8_ = 0x7fffffff7fffffff;
      auVar128._12_4_ = 0x7fffffff;
      auVar128._16_4_ = 0x7fffffff;
      auVar128._20_4_ = 0x7fffffff;
      auVar128._24_4_ = 0x7fffffff;
      auVar128._28_4_ = 0x7fffffff;
      auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar222,auVar101);
      auVar101 = vandps_avx(ZEXT1632(auVar97),auVar128);
      auVar110 = vandps_avx(ZEXT1632(auVar143),auVar128);
      auVar110 = vmaxps_avx(auVar101,auVar110);
      auVar101 = vandps_avx(ZEXT1632(auVar123),auVar128);
      auVar101 = vmaxps_avx(auVar110,auVar101);
      auVar152._4_4_ = fVar142;
      auVar152._0_4_ = fVar142;
      auVar152._8_4_ = fVar142;
      auVar152._12_4_ = fVar142;
      auVar152._16_4_ = fVar142;
      auVar152._20_4_ = fVar142;
      auVar152._24_4_ = fVar142;
      auVar152._28_4_ = fVar142;
      auVar101 = vcmpps_avx(auVar101,auVar152,1);
      auVar8 = vblendvps_avx(ZEXT1632(auVar97),_local_320,auVar101);
      auVar155 = vblendvps_avx(ZEXT1632(auVar143),auVar20,auVar101);
      auVar101 = vandps_avx(ZEXT1632(auVar96),auVar128);
      auVar110 = vandps_avx(ZEXT1632(auVar158),auVar128);
      auVar105 = vmaxps_avx(auVar101,auVar110);
      auVar101 = vandps_avx(ZEXT1632(auVar166),auVar128);
      auVar101 = vmaxps_avx(auVar105,auVar101);
      auVar131 = vcmpps_avx(auVar101,auVar152,1);
      auVar101 = vblendvps_avx(ZEXT1632(auVar96),_local_320,auVar131);
      auVar105 = vblendvps_avx(ZEXT1632(auVar158),auVar20,auVar131);
      auVar161 = vfmadd213ps_fma(auVar107,auVar222,ZEXT1632(auVar161));
      auVar97 = vfmadd213ps_fma(auVar8,auVar8,ZEXT832(0) << 0x20);
      auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar155,auVar155);
      auVar107 = vrsqrtps_avx(ZEXT1632(auVar97));
      fVar141 = auVar107._0_4_;
      fVar112 = auVar107._4_4_;
      fVar114 = auVar107._8_4_;
      fVar116 = auVar107._12_4_;
      fVar117 = auVar107._16_4_;
      fVar118 = auVar107._20_4_;
      fVar119 = auVar107._24_4_;
      auVar20._4_4_ = fVar112 * fVar112 * fVar112 * auVar97._4_4_ * -0.5;
      auVar20._0_4_ = fVar141 * fVar141 * fVar141 * auVar97._0_4_ * -0.5;
      auVar20._8_4_ = fVar114 * fVar114 * fVar114 * auVar97._8_4_ * -0.5;
      auVar20._12_4_ = fVar116 * fVar116 * fVar116 * auVar97._12_4_ * -0.5;
      auVar20._16_4_ = fVar117 * fVar117 * fVar117 * -0.0;
      auVar20._20_4_ = fVar118 * fVar118 * fVar118 * -0.0;
      auVar20._24_4_ = fVar119 * fVar119 * fVar119 * -0.0;
      auVar20._28_4_ = auVar110._28_4_;
      auVar233._8_4_ = 0x3fc00000;
      auVar233._0_8_ = 0x3fc000003fc00000;
      auVar233._12_4_ = 0x3fc00000;
      auVar233._16_4_ = 0x3fc00000;
      auVar233._20_4_ = 0x3fc00000;
      auVar233._24_4_ = 0x3fc00000;
      auVar233._28_4_ = 0x3fc00000;
      auVar97 = vfmadd231ps_fma(auVar20,auVar233,auVar107);
      fVar141 = auVar97._0_4_;
      fVar112 = auVar97._4_4_;
      auVar25._4_4_ = fVar112 * auVar155._4_4_;
      auVar25._0_4_ = fVar141 * auVar155._0_4_;
      fVar114 = auVar97._8_4_;
      auVar25._8_4_ = fVar114 * auVar155._8_4_;
      fVar116 = auVar97._12_4_;
      auVar25._12_4_ = fVar116 * auVar155._12_4_;
      auVar25._16_4_ = auVar155._16_4_ * 0.0;
      auVar25._20_4_ = auVar155._20_4_ * 0.0;
      auVar25._24_4_ = auVar155._24_4_ * 0.0;
      auVar25._28_4_ = 0;
      auVar26._4_4_ = fVar112 * -auVar8._4_4_;
      auVar26._0_4_ = fVar141 * -auVar8._0_4_;
      auVar26._8_4_ = fVar114 * -auVar8._8_4_;
      auVar26._12_4_ = fVar116 * -auVar8._12_4_;
      auVar26._16_4_ = -auVar8._16_4_ * 0.0;
      auVar26._20_4_ = -auVar8._20_4_ * 0.0;
      auVar26._24_4_ = -auVar8._24_4_ * 0.0;
      auVar26._28_4_ = auVar107._28_4_;
      auVar97 = vfmadd213ps_fma(auVar101,auVar101,ZEXT832(0) << 0x20);
      auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar105,auVar105);
      auVar110 = vrsqrtps_avx(ZEXT1632(auVar97));
      auVar27._28_4_ = auVar131._28_4_;
      auVar27._0_28_ =
           ZEXT1628(CONCAT412(fVar116 * 0.0,
                              CONCAT48(fVar114 * 0.0,CONCAT44(fVar112 * 0.0,fVar141 * 0.0))));
      fVar141 = auVar110._0_4_;
      fVar112 = auVar110._4_4_;
      fVar114 = auVar110._8_4_;
      fVar116 = auVar110._12_4_;
      fVar117 = auVar110._16_4_;
      fVar118 = auVar110._20_4_;
      fVar119 = auVar110._24_4_;
      auVar28._4_4_ = fVar112 * fVar112 * fVar112 * auVar97._4_4_ * -0.5;
      auVar28._0_4_ = fVar141 * fVar141 * fVar141 * auVar97._0_4_ * -0.5;
      auVar28._8_4_ = fVar114 * fVar114 * fVar114 * auVar97._8_4_ * -0.5;
      auVar28._12_4_ = fVar116 * fVar116 * fVar116 * auVar97._12_4_ * -0.5;
      auVar28._16_4_ = fVar117 * fVar117 * fVar117 * -0.0;
      auVar28._20_4_ = fVar118 * fVar118 * fVar118 * -0.0;
      auVar28._24_4_ = fVar119 * fVar119 * fVar119 * -0.0;
      auVar28._28_4_ = 0;
      auVar97 = vfmadd231ps_fma(auVar28,auVar233,auVar110);
      fVar141 = auVar97._0_4_;
      auVar218._0_4_ = auVar105._0_4_ * fVar141;
      fVar112 = auVar97._4_4_;
      auVar218._4_4_ = auVar105._4_4_ * fVar112;
      fVar114 = auVar97._8_4_;
      auVar218._8_4_ = auVar105._8_4_ * fVar114;
      fVar116 = auVar97._12_4_;
      auVar218._12_4_ = auVar105._12_4_ * fVar116;
      auVar218._16_4_ = auVar105._16_4_ * 0.0;
      auVar218._20_4_ = auVar105._20_4_ * 0.0;
      auVar218._24_4_ = auVar105._24_4_ * 0.0;
      auVar218._28_4_ = 0;
      auVar29._4_4_ = -auVar101._4_4_ * fVar112;
      auVar29._0_4_ = -auVar101._0_4_ * fVar141;
      auVar29._8_4_ = -auVar101._8_4_ * fVar114;
      auVar29._12_4_ = -auVar101._12_4_ * fVar116;
      auVar29._16_4_ = -auVar101._16_4_ * 0.0;
      auVar29._20_4_ = -auVar101._20_4_ * 0.0;
      auVar29._24_4_ = -auVar101._24_4_ * 0.0;
      auVar29._28_4_ = auVar105._28_4_;
      auVar30._28_4_ = auVar110._28_4_;
      auVar30._0_28_ =
           ZEXT1628(CONCAT412(fVar116 * 0.0,
                              CONCAT48(fVar114 * 0.0,CONCAT44(fVar112 * 0.0,fVar141 * 0.0))));
      auVar97 = vfmadd213ps_fma(auVar25,ZEXT1632(auVar122),auVar126);
      auVar101 = ZEXT1632(auVar122);
      auVar96 = vfmadd213ps_fma(auVar26,auVar101,_local_2e0);
      auVar143 = vfmadd213ps_fma(auVar27,auVar101,ZEXT1632(auVar161));
      auVar166 = vfnmadd213ps_fma(auVar25,auVar101,auVar126);
      auVar123 = vfmadd213ps_fma(auVar218,ZEXT1632(auVar95),auVar99);
      auVar94 = vfnmadd213ps_fma(auVar26,auVar101,_local_2e0);
      auVar194 = ZEXT1632(auVar95);
      auVar95 = vfmadd213ps_fma(auVar29,auVar194,local_2c0);
      auVar127 = ZEXT1632(auVar122);
      auVar172 = vfnmadd231ps_fma(ZEXT1632(auVar161),auVar127,auVar27);
      auVar122 = vfmadd213ps_fma(auVar30,auVar194,_local_5c0);
      auVar121 = vfnmadd213ps_fma(auVar218,auVar194,auVar99);
      auVar165 = vfnmadd213ps_fma(auVar29,auVar194,local_2c0);
      auVar173 = vfnmadd231ps_fma(_local_5c0,auVar194,auVar30);
      auVar101 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar94));
      auVar110 = vsubps_avx(ZEXT1632(auVar122),ZEXT1632(auVar172));
      auVar99._4_4_ = auVar172._4_4_ * auVar101._4_4_;
      auVar99._0_4_ = auVar172._0_4_ * auVar101._0_4_;
      auVar99._8_4_ = auVar172._8_4_ * auVar101._8_4_;
      auVar99._12_4_ = auVar172._12_4_ * auVar101._12_4_;
      auVar99._16_4_ = auVar101._16_4_ * 0.0;
      auVar99._20_4_ = auVar101._20_4_ * 0.0;
      auVar99._24_4_ = auVar101._24_4_ * 0.0;
      auVar99._28_4_ = 0;
      auVar158 = vfmsub231ps_fma(auVar99,ZEXT1632(auVar94),auVar110);
      auVar126._4_4_ = auVar110._4_4_ * auVar166._4_4_;
      auVar126._0_4_ = auVar110._0_4_ * auVar166._0_4_;
      auVar126._8_4_ = auVar110._8_4_ * auVar166._8_4_;
      auVar126._12_4_ = auVar110._12_4_ * auVar166._12_4_;
      auVar126._16_4_ = auVar110._16_4_ * 0.0;
      auVar126._20_4_ = auVar110._20_4_ * 0.0;
      auVar126._24_4_ = auVar110._24_4_ * 0.0;
      auVar126._28_4_ = auVar110._28_4_;
      auVar110 = vsubps_avx(ZEXT1632(auVar123),ZEXT1632(auVar166));
      auVar161 = vfmsub231ps_fma(auVar126,ZEXT1632(auVar172),auVar110);
      auVar31._4_4_ = auVar94._4_4_ * auVar110._4_4_;
      auVar31._0_4_ = auVar94._0_4_ * auVar110._0_4_;
      auVar31._8_4_ = auVar94._8_4_ * auVar110._8_4_;
      auVar31._12_4_ = auVar94._12_4_ * auVar110._12_4_;
      auVar31._16_4_ = auVar110._16_4_ * 0.0;
      auVar31._20_4_ = auVar110._20_4_ * 0.0;
      auVar31._24_4_ = auVar110._24_4_ * 0.0;
      auVar31._28_4_ = auVar110._28_4_;
      auVar131 = ZEXT1632(auVar166);
      auVar166 = vfmsub231ps_fma(auVar31,auVar131,auVar101);
      auVar161 = vfmadd231ps_fma(ZEXT1632(auVar166),ZEXT832(0) << 0x20,ZEXT1632(auVar161));
      auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),ZEXT832(0) << 0x20,ZEXT1632(auVar158));
      auVar100 = vcmpps_avx(ZEXT1632(auVar161),ZEXT832(0) << 0x20,2);
      auVar101 = vblendvps_avx(ZEXT1632(auVar121),ZEXT1632(auVar97),auVar100);
      auVar110 = vblendvps_avx(ZEXT1632(auVar165),ZEXT1632(auVar96),auVar100);
      auVar8 = vblendvps_avx(ZEXT1632(auVar173),ZEXT1632(auVar143),auVar100);
      auVar107 = vblendvps_avx(auVar131,ZEXT1632(auVar123),auVar100);
      auVar155 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar95),auVar100);
      auVar189 = ZEXT3264(auVar155);
      auVar105 = vblendvps_avx(ZEXT1632(auVar172),ZEXT1632(auVar122),auVar100);
      auVar131 = vblendvps_avx(ZEXT1632(auVar123),auVar131,auVar100);
      auVar106 = vblendvps_avx(ZEXT1632(auVar95),ZEXT1632(auVar94),auVar100);
      auVar161 = vpackssdw_avx(local_300._0_16_,local_300._16_16_);
      auVar20 = vblendvps_avx(ZEXT1632(auVar122),ZEXT1632(auVar172),auVar100);
      auVar135 = vsubps_avx(auVar131,auVar101);
      auVar154 = vsubps_avx(auVar106,auVar110);
      auVar187 = vsubps_avx(auVar20,auVar8);
      auVar228 = vsubps_avx(auVar101,auVar107);
      auVar99 = vsubps_avx(auVar110,auVar155);
      auVar126 = vsubps_avx(auVar8,auVar105);
      auVar32._4_4_ = auVar187._4_4_ * auVar101._4_4_;
      auVar32._0_4_ = auVar187._0_4_ * auVar101._0_4_;
      auVar32._8_4_ = auVar187._8_4_ * auVar101._8_4_;
      auVar32._12_4_ = auVar187._12_4_ * auVar101._12_4_;
      auVar32._16_4_ = auVar187._16_4_ * auVar101._16_4_;
      auVar32._20_4_ = auVar187._20_4_ * auVar101._20_4_;
      auVar32._24_4_ = auVar187._24_4_ * auVar101._24_4_;
      auVar32._28_4_ = auVar20._28_4_;
      auVar97 = vfmsub231ps_fma(auVar32,auVar8,auVar135);
      auVar33._4_4_ = auVar135._4_4_ * auVar110._4_4_;
      auVar33._0_4_ = auVar135._0_4_ * auVar110._0_4_;
      auVar33._8_4_ = auVar135._8_4_ * auVar110._8_4_;
      auVar33._12_4_ = auVar135._12_4_ * auVar110._12_4_;
      auVar33._16_4_ = auVar135._16_4_ * auVar110._16_4_;
      auVar33._20_4_ = auVar135._20_4_ * auVar110._20_4_;
      auVar33._24_4_ = auVar135._24_4_ * auVar110._24_4_;
      auVar33._28_4_ = auVar131._28_4_;
      auVar96 = vfmsub231ps_fma(auVar33,auVar101,auVar154);
      auVar97 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT832(0) << 0x20,ZEXT1632(auVar97));
      auVar102._0_4_ = auVar154._0_4_ * auVar8._0_4_;
      auVar102._4_4_ = auVar154._4_4_ * auVar8._4_4_;
      auVar102._8_4_ = auVar154._8_4_ * auVar8._8_4_;
      auVar102._12_4_ = auVar154._12_4_ * auVar8._12_4_;
      auVar102._16_4_ = auVar154._16_4_ * auVar8._16_4_;
      auVar102._20_4_ = auVar154._20_4_ * auVar8._20_4_;
      auVar102._24_4_ = auVar154._24_4_ * auVar8._24_4_;
      auVar102._28_4_ = 0;
      auVar96 = vfmsub231ps_fma(auVar102,auVar110,auVar187);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar97),ZEXT832(0) << 0x20,ZEXT1632(auVar96));
      auVar103._0_4_ = auVar126._0_4_ * auVar107._0_4_;
      auVar103._4_4_ = auVar126._4_4_ * auVar107._4_4_;
      auVar103._8_4_ = auVar126._8_4_ * auVar107._8_4_;
      auVar103._12_4_ = auVar126._12_4_ * auVar107._12_4_;
      auVar103._16_4_ = auVar126._16_4_ * auVar107._16_4_;
      auVar103._20_4_ = auVar126._20_4_ * auVar107._20_4_;
      auVar103._24_4_ = auVar126._24_4_ * auVar107._24_4_;
      auVar103._28_4_ = 0;
      auVar97 = vfmsub231ps_fma(auVar103,auVar228,auVar105);
      auVar34._4_4_ = auVar99._4_4_ * auVar105._4_4_;
      auVar34._0_4_ = auVar99._0_4_ * auVar105._0_4_;
      auVar34._8_4_ = auVar99._8_4_ * auVar105._8_4_;
      auVar34._12_4_ = auVar99._12_4_ * auVar105._12_4_;
      auVar34._16_4_ = auVar99._16_4_ * auVar105._16_4_;
      auVar34._20_4_ = auVar99._20_4_ * auVar105._20_4_;
      auVar34._24_4_ = auVar99._24_4_ * auVar105._24_4_;
      auVar34._28_4_ = auVar105._28_4_;
      auVar143 = vfmsub231ps_fma(auVar34,auVar155,auVar126);
      auVar35._4_4_ = auVar228._4_4_ * auVar155._4_4_;
      auVar35._0_4_ = auVar228._0_4_ * auVar155._0_4_;
      auVar35._8_4_ = auVar228._8_4_ * auVar155._8_4_;
      auVar35._12_4_ = auVar228._12_4_ * auVar155._12_4_;
      auVar35._16_4_ = auVar228._16_4_ * auVar155._16_4_;
      auVar35._20_4_ = auVar228._20_4_ * auVar155._20_4_;
      auVar35._24_4_ = auVar228._24_4_ * auVar155._24_4_;
      auVar35._28_4_ = auVar106._28_4_;
      auVar122 = vfmsub231ps_fma(auVar35,auVar99,auVar107);
      auVar97 = vfmadd231ps_fma(ZEXT1632(auVar122),ZEXT832(0) << 0x20,ZEXT1632(auVar97));
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar97),ZEXT832(0) << 0x20,ZEXT1632(auVar143));
      auVar107 = vmaxps_avx(ZEXT1632(auVar96),ZEXT1632(auVar143));
      auVar107 = vcmpps_avx(auVar107,ZEXT832(0) << 0x20,2);
      auVar97 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
      auVar161 = vpand_avx(auVar97,auVar161);
      auVar107 = vpmovsxwd_avx2(auVar161);
      if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar107 >> 0x7f,0) == '\0') &&
            (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar107 >> 0xbf,0) == '\0') &&
          (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar107[0x1f]) {
LAB_010fcb5a:
        auVar171._8_8_ = local_540[1]._8_8_;
        auVar171._0_8_ = local_540[1]._0_8_;
        auVar171._16_8_ = local_540[1]._16_8_;
        auVar171._24_8_ = local_540[1]._24_8_;
        auVar204 = ZEXT3264(CONCAT428(fStack_63c,
                                      CONCAT424(local_640,
                                                CONCAT420(fStack_63c,
                                                          CONCAT416(local_640,
                                                                    CONCAT412(fStack_63c,
                                                                              CONCAT48(local_640,
                                                                                       uVar93)))))))
        ;
      }
      else {
        auVar36._4_4_ = auVar154._4_4_ * auVar126._4_4_;
        auVar36._0_4_ = auVar154._0_4_ * auVar126._0_4_;
        auVar36._8_4_ = auVar154._8_4_ * auVar126._8_4_;
        auVar36._12_4_ = auVar154._12_4_ * auVar126._12_4_;
        auVar36._16_4_ = auVar154._16_4_ * auVar126._16_4_;
        auVar36._20_4_ = auVar154._20_4_ * auVar126._20_4_;
        auVar36._24_4_ = auVar154._24_4_ * auVar126._24_4_;
        auVar36._28_4_ = auVar107._28_4_;
        auVar123 = vfmsub231ps_fma(auVar36,auVar99,auVar187);
        auVar129._0_4_ = auVar187._0_4_ * auVar228._0_4_;
        auVar129._4_4_ = auVar187._4_4_ * auVar228._4_4_;
        auVar129._8_4_ = auVar187._8_4_ * auVar228._8_4_;
        auVar129._12_4_ = auVar187._12_4_ * auVar228._12_4_;
        auVar129._16_4_ = auVar187._16_4_ * auVar228._16_4_;
        auVar129._20_4_ = auVar187._20_4_ * auVar228._20_4_;
        auVar129._24_4_ = auVar187._24_4_ * auVar228._24_4_;
        auVar129._28_4_ = 0;
        auVar95 = vfmsub231ps_fma(auVar129,auVar135,auVar126);
        auVar37._4_4_ = auVar135._4_4_ * auVar99._4_4_;
        auVar37._0_4_ = auVar135._0_4_ * auVar99._0_4_;
        auVar37._8_4_ = auVar135._8_4_ * auVar99._8_4_;
        auVar37._12_4_ = auVar135._12_4_ * auVar99._12_4_;
        auVar37._16_4_ = auVar135._16_4_ * auVar99._16_4_;
        auVar37._20_4_ = auVar135._20_4_ * auVar99._20_4_;
        auVar37._24_4_ = auVar135._24_4_ * auVar99._24_4_;
        auVar37._28_4_ = auVar155._28_4_;
        auVar158 = vfmsub231ps_fma(auVar37,auVar228,auVar154);
        auVar97 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar95),ZEXT1632(auVar158));
        auVar122 = vfmadd231ps_fma(ZEXT1632(auVar97),ZEXT1632(auVar123),_DAT_01f7b000);
        auVar107 = vrcpps_avx(ZEXT1632(auVar122));
        auVar219._8_4_ = 0x3f800000;
        auVar219._0_8_ = 0x3f8000003f800000;
        auVar219._12_4_ = 0x3f800000;
        auVar219._16_4_ = 0x3f800000;
        auVar219._20_4_ = 0x3f800000;
        auVar219._24_4_ = 0x3f800000;
        auVar219._28_4_ = 0x3f800000;
        auVar97 = vfnmadd213ps_fma(auVar107,ZEXT1632(auVar122),auVar219);
        auVar97 = vfmadd132ps_fma(ZEXT1632(auVar97),auVar107,auVar107);
        auVar186._0_4_ = auVar158._0_4_ * auVar8._0_4_;
        auVar186._4_4_ = auVar158._4_4_ * auVar8._4_4_;
        auVar186._8_4_ = auVar158._8_4_ * auVar8._8_4_;
        auVar186._12_4_ = auVar158._12_4_ * auVar8._12_4_;
        auVar186._16_4_ = auVar8._16_4_ * 0.0;
        auVar186._20_4_ = auVar8._20_4_ * 0.0;
        auVar186._24_4_ = auVar8._24_4_ * 0.0;
        auVar186._28_4_ = 0;
        auVar95 = vfmadd231ps_fma(auVar186,auVar110,ZEXT1632(auVar95));
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT1632(auVar123),auVar101);
        fVar141 = auVar97._0_4_;
        fVar112 = auVar97._4_4_;
        fVar114 = auVar97._8_4_;
        fVar116 = auVar97._12_4_;
        auVar155 = ZEXT1632(CONCAT412(fVar116 * auVar95._12_4_,
                                      CONCAT48(fVar114 * auVar95._8_4_,
                                               CONCAT44(fVar112 * auVar95._4_4_,
                                                        fVar141 * auVar95._0_4_))));
        auVar189 = ZEXT3264(auVar155);
        auVar104._4_4_ = uVar5;
        auVar104._0_4_ = uVar5;
        auVar104._8_4_ = uVar5;
        auVar104._12_4_ = uVar5;
        auVar104._16_4_ = uVar5;
        auVar104._20_4_ = uVar5;
        auVar104._24_4_ = uVar5;
        auVar104._28_4_ = uVar5;
        uVar91 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar130._4_4_ = uVar91;
        auVar130._0_4_ = uVar91;
        auVar130._8_4_ = uVar91;
        auVar130._12_4_ = uVar91;
        auVar130._16_4_ = uVar91;
        auVar130._20_4_ = uVar91;
        auVar130._24_4_ = uVar91;
        auVar130._28_4_ = uVar91;
        auVar110 = vcmpps_avx(auVar104,auVar155,2);
        auVar107 = vcmpps_avx(auVar155,auVar130,2);
        auVar110 = vandps_avx(auVar107,auVar110);
        auVar97 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
        auVar161 = vpand_avx(auVar161,auVar97);
        auVar110 = vpmovsxwd_avx2(auVar161);
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar110 >> 0x7f,0) == '\0') &&
              (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar110 >> 0xbf,0) == '\0') &&
            (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar110[0x1f]) goto LAB_010fcb5a;
        auVar110 = vcmpps_avx(ZEXT1632(auVar122),ZEXT832(0) << 0x20,4);
        auVar97 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
        auVar161 = vpand_avx(auVar161,auVar97);
        auVar110 = vpmovsxwd_avx2(auVar161);
        auVar171._8_8_ = local_540[1]._8_8_;
        auVar171._0_8_ = local_540[1]._0_8_;
        auVar171._16_8_ = local_540[1]._16_8_;
        auVar171._24_8_ = local_540[1]._24_8_;
        auVar204 = ZEXT3264(CONCAT428(fStack_63c,
                                      CONCAT424(local_640,
                                                CONCAT420(fStack_63c,
                                                          CONCAT416(local_640,
                                                                    CONCAT412(fStack_63c,
                                                                              CONCAT48(local_640,
                                                                                       uVar93)))))))
        ;
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0x7f,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar110 >> 0xbf,0) != '\0') ||
            (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar110[0x1f] < '\0') {
          auVar105 = ZEXT1632(CONCAT412(fVar116 * auVar96._12_4_,
                                        CONCAT48(fVar114 * auVar96._8_4_,
                                                 CONCAT44(fVar112 * auVar96._4_4_,
                                                          fVar141 * auVar96._0_4_))));
          auVar131 = ZEXT1632(CONCAT412(fVar116 * auVar143._12_4_,
                                        CONCAT48(fVar114 * auVar143._8_4_,
                                                 CONCAT44(fVar112 * auVar143._4_4_,
                                                          fVar141 * auVar143._0_4_))));
          auVar170._8_4_ = 0x3f800000;
          auVar170._0_8_ = 0x3f8000003f800000;
          auVar170._12_4_ = 0x3f800000;
          auVar170._16_4_ = 0x3f800000;
          auVar170._20_4_ = 0x3f800000;
          auVar170._24_4_ = 0x3f800000;
          auVar170._28_4_ = 0x3f800000;
          auVar107 = vsubps_avx(auVar170,auVar105);
          _local_120 = vblendvps_avx(auVar107,auVar105,auVar100);
          auVar107 = vsubps_avx(auVar170,auVar131);
          local_340 = vblendvps_avx(auVar107,auVar131,auVar100);
          auVar171 = auVar110;
          local_4e0 = auVar155;
        }
      }
      auVar235 = ZEXT3264(local_7a0);
      auVar229 = ZEXT3264(local_6c0);
      auVar226 = ZEXT3264(_local_6e0);
      auVar164 = ZEXT3264(auVar222);
      auVar140 = ZEXT3264(auVar217);
      if ((((((((auVar171 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar171 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar171 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar171 >> 0x7f,0) == '\0') &&
            (auVar171 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar171 >> 0xbf,0) == '\0') &&
          (auVar171 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar171[0x1f]) {
        auVar140 = ZEXT3264(local_660);
        auVar164 = ZEXT3264(local_560);
        auVar157 = ZEXT3264(local_5e0);
        auVar197 = ZEXT3264(local_720);
      }
      else {
        auVar110 = vsubps_avx(auVar194,auVar127);
        auVar161 = vfmadd213ps_fma(auVar110,_local_120,auVar127);
        fVar141 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        auVar38._4_4_ = (auVar161._4_4_ + auVar161._4_4_) * fVar141;
        auVar38._0_4_ = (auVar161._0_4_ + auVar161._0_4_) * fVar141;
        auVar38._8_4_ = (auVar161._8_4_ + auVar161._8_4_) * fVar141;
        auVar38._12_4_ = (auVar161._12_4_ + auVar161._12_4_) * fVar141;
        auVar38._16_4_ = fVar141 * 0.0;
        auVar38._20_4_ = fVar141 * 0.0;
        auVar38._24_4_ = fVar141 * 0.0;
        auVar38._28_4_ = 0;
        auVar189 = ZEXT3264(local_4e0);
        auVar110 = vcmpps_avx(local_4e0,auVar38,6);
        auVar107 = auVar171 & auVar110;
        auVar157 = ZEXT3264(local_5e0);
        auVar197 = ZEXT3264(local_720);
        if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar107 >> 0x7f,0) == '\0') &&
              (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar107 >> 0xbf,0) == '\0') &&
            (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar107[0x1f]) {
          auVar140 = ZEXT3264(local_660);
          auVar164 = ZEXT3264(local_560);
        }
        else {
          auVar132._8_4_ = 0xbf800000;
          auVar132._0_8_ = 0xbf800000bf800000;
          auVar132._12_4_ = 0xbf800000;
          auVar132._16_4_ = 0xbf800000;
          auVar132._20_4_ = 0xbf800000;
          auVar132._24_4_ = 0xbf800000;
          auVar132._28_4_ = 0xbf800000;
          auVar153._8_4_ = 0x40000000;
          auVar153._0_8_ = 0x4000000040000000;
          auVar153._12_4_ = 0x40000000;
          auVar153._16_4_ = 0x40000000;
          auVar153._20_4_ = 0x40000000;
          auVar153._24_4_ = 0x40000000;
          auVar153._28_4_ = 0x40000000;
          auVar161 = vfmadd213ps_fma(local_340,auVar153,auVar132);
          local_260 = _local_120;
          local_340 = ZEXT1632(auVar161);
          auVar107 = local_340;
          local_240 = ZEXT1632(auVar161);
          local_220 = local_4e0;
          local_200 = 0;
          local_1fc = iVar11;
          local_1f0 = uVar79;
          uStack_1e8 = uVar80;
          local_1e0 = local_7c0;
          uStack_1d8 = uStack_7b8;
          local_1d0 = local_7d0;
          uStack_1c8 = uStack_7c8;
          local_1c0 = local_7e0;
          uStack_1b8 = uStack_7d8;
          local_340 = auVar107;
          if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_540[0] = vandps_avx(auVar110,auVar171);
            fVar141 = 1.0 / (float)local_460._0_4_;
            local_180[0] = fVar141 * ((float)local_120._0_4_ + 0.0);
            local_180[1] = fVar141 * ((float)local_120._4_4_ + 1.0);
            local_180[2] = fVar141 * (fStack_118 + 2.0);
            local_180[3] = fVar141 * (fStack_114 + 3.0);
            fStack_170 = fVar141 * (fStack_110 + 4.0);
            fStack_16c = fVar141 * (fStack_10c + 5.0);
            fStack_168 = fVar141 * (fStack_108 + 6.0);
            fStack_164 = fStack_104 + 7.0;
            local_340._0_8_ = auVar161._0_8_;
            local_340._8_8_ = auVar161._8_8_;
            local_160 = local_340._0_8_;
            uStack_158 = local_340._8_8_;
            uStack_150 = 0;
            uStack_148 = 0;
            local_140 = local_4e0;
            auVar133._8_4_ = 0x7f800000;
            auVar133._0_8_ = 0x7f8000007f800000;
            auVar133._12_4_ = 0x7f800000;
            auVar133._16_4_ = 0x7f800000;
            auVar133._20_4_ = 0x7f800000;
            auVar133._24_4_ = 0x7f800000;
            auVar133._28_4_ = 0x7f800000;
            auVar110 = vblendvps_avx(auVar133,local_4e0,local_540[0]);
            auVar107 = vshufps_avx(auVar110,auVar110,0xb1);
            auVar107 = vminps_avx(auVar110,auVar107);
            auVar155 = vshufpd_avx(auVar107,auVar107,5);
            auVar107 = vminps_avx(auVar107,auVar155);
            auVar155 = vpermpd_avx2(auVar107,0x4e);
            auVar107 = vminps_avx(auVar107,auVar155);
            auVar107 = vcmpps_avx(auVar110,auVar107,0);
            auVar155 = local_540[0] & auVar107;
            auVar110 = local_540[0];
            if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar155 >> 0x7f,0) != '\0') ||
                  (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar155 >> 0xbf,0) != '\0') ||
                (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar155[0x1f] < '\0') {
              auVar110 = vandps_avx(auVar107,local_540[0]);
            }
            uVar85 = vmovmskps_avx(auVar110);
            uVar5 = 0;
            for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
              uVar5 = uVar5 + 1;
            }
            uVar86 = (ulong)uVar5;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar141 = local_180[uVar86];
              uVar91 = *(undefined4 *)((long)&local_160 + uVar86 * 4);
              fVar114 = 1.0 - fVar141;
              fVar112 = fVar114 * fVar114 * -3.0;
              auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar114 * fVar114)),
                                        ZEXT416((uint)(fVar141 * fVar114)),ZEXT416(0xc0000000));
              auVar161 = vfmsub132ss_fma(ZEXT416((uint)(fVar141 * fVar114)),
                                         ZEXT416((uint)(fVar141 * fVar141)),ZEXT416(0x40000000));
              auVar189 = ZEXT464(0x40400000);
              fVar114 = auVar15._0_4_ * 3.0;
              fVar116 = auVar161._0_4_ * 3.0;
              fVar117 = fVar141 * fVar141 * 3.0;
              auVar175._0_4_ = fVar117 * fVar111;
              auVar175._4_4_ = fVar117 * fVar113;
              auVar175._8_4_ = fVar117 * fVar115;
              auVar175._12_4_ = fVar117 * fVar69;
              auVar144._4_4_ = fVar116;
              auVar144._0_4_ = fVar116;
              auVar144._8_4_ = fVar116;
              auVar144._12_4_ = fVar116;
              auVar15 = vfmadd132ps_fma(auVar144,auVar175,auVar19);
              auVar159._4_4_ = fVar114;
              auVar159._0_4_ = fVar114;
              auVar159._8_4_ = fVar114;
              auVar159._12_4_ = fVar114;
              auVar15 = vfmadd132ps_fma(auVar159,auVar15,auVar18);
              auVar145._4_4_ = fVar112;
              auVar145._0_4_ = fVar112;
              auVar145._8_4_ = fVar112;
              auVar145._12_4_ = fVar112;
              auVar15 = vfmadd132ps_fma(auVar145,auVar15,*(undefined1 (*) [16])pPVar1);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + uVar86 * 4);
              *(int *)(ray + k * 4 + 0xc0) = auVar15._0_4_;
              uVar220 = vextractps_avx(auVar15,1);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar220;
              uVar220 = vextractps_avx(auVar15,2);
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar220;
              *(float *)(ray + k * 4 + 0xf0) = fVar141;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar91;
              *(uint *)(ray + k * 4 + 0x110) = uVar84;
              *(uint *)(ray + k * 4 + 0x120) = uVar10;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              local_700._4_4_ = uVar10;
              local_700._0_4_ = uVar10;
              local_700._8_4_ = uVar10;
              local_700._16_16_ = auVar8._16_16_;
              local_700._12_4_ = uVar10;
              local_580._0_8_ = CONCAT44(uVar84,uVar84);
              local_580 = ZEXT1632(CONCAT412(uVar84,CONCAT48(uVar84,local_580._0_8_)));
              local_5a0 = ZEXT1632(*local_688);
              auStack_7f0 = auVar101._16_16_;
              local_800 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              local_780 = auVar222;
              local_620 = auVar217;
              while( true ) {
                auVar101 = _local_800;
                local_3e0 = local_180[uVar86];
                local_3d0 = *(undefined4 *)((long)&local_160 + uVar86 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + uVar86 * 4);
                fVar114 = 1.0 - local_3e0;
                auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar114 * fVar114)),
                                          ZEXT416((uint)(local_3e0 * fVar114)),ZEXT416(0xc0000000));
                auVar161 = vfmsub132ss_fma(ZEXT416((uint)(local_3e0 * fVar114)),
                                           ZEXT416((uint)(local_3e0 * local_3e0)),
                                           ZEXT416(0x40000000));
                auVar189 = ZEXT464(0x40400000);
                fVar141 = auVar161._0_4_ * 3.0;
                fVar112 = local_3e0 * local_3e0 * 3.0;
                auVar178._0_4_ = fVar112 * fVar111;
                auVar178._4_4_ = fVar112 * fVar113;
                auVar178._8_4_ = fVar112 * fVar115;
                auVar178._12_4_ = fVar112 * fVar69;
                auVar150._4_4_ = fVar141;
                auVar150._0_4_ = fVar141;
                auVar150._8_4_ = fVar141;
                auVar150._12_4_ = fVar141;
                auVar161 = vfmadd132ps_fma(auVar150,auVar178,auVar19);
                fVar141 = auVar97._0_4_ * 3.0;
                auVar169._4_4_ = fVar141;
                auVar169._0_4_ = fVar141;
                auVar169._8_4_ = fVar141;
                auVar169._12_4_ = fVar141;
                auVar161 = vfmadd132ps_fma(auVar169,auVar161,auVar18);
                fVar141 = fVar114 * fVar114 * -3.0;
                local_750.context = context->user;
                auVar151._4_4_ = fVar141;
                auVar151._0_4_ = fVar141;
                auVar151._8_4_ = fVar141;
                auVar151._12_4_ = fVar141;
                auVar97 = vfmadd132ps_fma(auVar151,auVar161,auVar15);
                local_410 = auVar97._0_4_;
                uStack_40c = local_410;
                uStack_408 = local_410;
                uStack_404 = local_410;
                auVar161 = vshufps_avx(auVar97,auVar97,0x55);
                local_400 = auVar161;
                local_3f0 = vshufps_avx(auVar97,auVar97,0xaa);
                fStack_3dc = local_3e0;
                fStack_3d8 = local_3e0;
                fStack_3d4 = local_3e0;
                uStack_3cc = local_3d0;
                uStack_3c8 = local_3d0;
                uStack_3c4 = local_3d0;
                local_3c0 = local_580._0_8_;
                uStack_3b8 = local_580._8_8_;
                local_3b0 = local_700._0_16_;
                vpcmpeqd_avx2(ZEXT1632(local_700._0_16_),ZEXT1632(local_700._0_16_));
                uStack_39c = (local_750.context)->instID[0];
                local_3a0 = uStack_39c;
                uStack_398 = uStack_39c;
                uStack_394 = uStack_39c;
                uStack_390 = (local_750.context)->instPrimID[0];
                uStack_38c = uStack_390;
                uStack_388 = uStack_390;
                uStack_384 = uStack_390;
                local_7b0 = local_5a0._0_16_;
                local_750.valid = (int *)local_7b0;
                local_750.geometryUserPtr = *(void **)(CONCAT44(uStack_4fc,local_500) + 0x18);
                local_750.hit = (RTCHitN *)&local_410;
                local_750.N = 4;
                pcVar14 = *(code **)(CONCAT44(uStack_4fc,local_500) + 0x40);
                local_750.ray = (RTCRayN *)ray;
                if (pcVar14 != (code *)0x0) {
                  auVar189 = ZEXT1664(auVar189._0_16_);
                  (*pcVar14)(&local_750);
                  auVar226 = ZEXT3264(_local_6e0);
                  auVar140 = ZEXT3264(local_620);
                  auVar229 = ZEXT3264(local_6c0);
                  auVar164 = ZEXT3264(local_780);
                  auVar235 = ZEXT3264(local_7a0);
                  auVar204 = ZEXT3264(CONCAT428(fStack_624,
                                                CONCAT424(fStack_628,
                                                          CONCAT420(fStack_62c,
                                                                    CONCAT416(fStack_630,
                                                                              CONCAT412(fStack_634,
                                                                                        CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
                  auVar197 = ZEXT3264(local_720);
                }
                if (local_7b0 == (undefined1  [16])0x0) {
                  auVar161 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar97 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                  auVar161 = auVar161 ^ auVar97;
                }
                else {
                  p_Var13 = context->args->filter;
                  auVar97 = vpcmpeqd_avx(auVar161,auVar161);
                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(CONCAT44(uStack_4fc,local_500) + 0x3e) & 0x40) != 0)))) {
                    auVar189 = ZEXT1664(auVar189._0_16_);
                    (*p_Var13)(&local_750);
                    auVar226 = ZEXT3264(_local_6e0);
                    auVar140 = ZEXT3264(local_620);
                    auVar229 = ZEXT3264(local_6c0);
                    auVar164 = ZEXT3264(local_780);
                    auVar235 = ZEXT3264(local_7a0);
                    auVar204 = ZEXT3264(CONCAT428(fStack_624,
                                                  CONCAT424(fStack_628,
                                                            CONCAT420(fStack_62c,
                                                                      CONCAT416(fStack_630,
                                                                                CONCAT412(fStack_634
                                                                                          ,CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
                    auVar197 = ZEXT3264(local_720);
                    auVar97 = vpcmpeqd_avx(auVar97,auVar97);
                  }
                  auVar96 = vpcmpeqd_avx(local_7b0,_DAT_01f45a50);
                  auVar161 = auVar96 ^ auVar97;
                  if (local_7b0 != (undefined1  [16])0x0) {
                    auVar96 = auVar96 ^ auVar97;
                    auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])local_750.hit);
                    *(undefined1 (*) [16])(local_750.ray + 0xc0) = auVar97;
                    auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])(local_750.hit + 0x10));
                    *(undefined1 (*) [16])(local_750.ray + 0xd0) = auVar97;
                    auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])(local_750.hit + 0x20));
                    *(undefined1 (*) [16])(local_750.ray + 0xe0) = auVar97;
                    auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])(local_750.hit + 0x30));
                    *(undefined1 (*) [16])(local_750.ray + 0xf0) = auVar97;
                    auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])(local_750.hit + 0x40));
                    *(undefined1 (*) [16])(local_750.ray + 0x100) = auVar97;
                    auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])(local_750.hit + 0x50));
                    *(undefined1 (*) [16])(local_750.ray + 0x110) = auVar97;
                    auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])(local_750.hit + 0x60));
                    *(undefined1 (*) [16])(local_750.ray + 0x120) = auVar97;
                    auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])(local_750.hit + 0x70));
                    *(undefined1 (*) [16])(local_750.ray + 0x130) = auVar97;
                    auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])(local_750.hit + 0x80));
                    *(undefined1 (*) [16])(local_750.ray + 0x140) = auVar97;
                  }
                }
                auVar110 = local_4e0;
                auVar222 = auVar164._0_32_;
                auVar217 = auVar140._0_32_;
                auVar125._8_8_ = 0x100000001;
                auVar125._0_8_ = 0x100000001;
                if ((auVar125 & auVar161) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_800._0_4_;
                }
                else {
                  local_800._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_800._4_4_ = 0;
                  local_800._8_4_ = 0;
                  local_800._12_4_ = 0;
                }
                *(undefined4 *)(local_540[0] + uVar86 * 4) = 0;
                auStack_7f0 = auVar101._16_16_;
                auVar109._4_4_ = local_800._0_4_;
                auVar109._0_4_ = local_800._0_4_;
                auVar109._8_4_ = local_800._0_4_;
                auVar109._12_4_ = local_800._0_4_;
                auVar109._16_4_ = local_800._0_4_;
                auVar109._20_4_ = local_800._0_4_;
                auVar109._24_4_ = local_800._0_4_;
                auVar109._28_4_ = local_800._0_4_;
                auVar8 = vcmpps_avx(auVar110,auVar109,2);
                auVar101 = vandps_avx(auVar8,local_540[0]);
                local_540[0] = local_540[0] & auVar8;
                if ((((((((local_540[0] >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_540[0] >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_540[0] >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_540[0] >> 0x7f,0) == '\0') &&
                      (local_540[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_540[0] >> 0xbf,0) == '\0') &&
                    (local_540[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_540[0][0x1f]) break;
                auVar139._8_4_ = 0x7f800000;
                auVar139._0_8_ = 0x7f8000007f800000;
                auVar139._12_4_ = 0x7f800000;
                auVar139._16_4_ = 0x7f800000;
                auVar139._20_4_ = 0x7f800000;
                auVar139._24_4_ = 0x7f800000;
                auVar139._28_4_ = 0x7f800000;
                auVar110 = vblendvps_avx(auVar139,auVar110,auVar101);
                auVar8 = vshufps_avx(auVar110,auVar110,0xb1);
                auVar8 = vminps_avx(auVar110,auVar8);
                auVar107 = vshufpd_avx(auVar8,auVar8,5);
                auVar8 = vminps_avx(auVar8,auVar107);
                auVar107 = vpermpd_avx2(auVar8,0x4e);
                auVar8 = vminps_avx(auVar8,auVar107);
                auVar8 = vcmpps_avx(auVar110,auVar8,0);
                auVar107 = auVar101 & auVar8;
                auVar110 = auVar101;
                if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar107 >> 0x7f,0) != '\0') ||
                      (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar107 >> 0xbf,0) != '\0') ||
                    (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar107[0x1f] < '\0') {
                  auVar110 = vandps_avx(auVar8,auVar101);
                }
                uVar85 = vmovmskps_avx(auVar110);
                uVar5 = 0;
                for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                  uVar5 = uVar5 + 1;
                }
                uVar86 = (ulong)uVar5;
                local_540[0] = auVar101;
              }
            }
          }
          auVar140 = ZEXT3264(local_660);
          auVar164 = ZEXT3264(local_560);
          auVar157 = ZEXT3264(local_5e0);
        }
      }
    }
    local_700._0_8_ = pPVar89;
    if (8 < iVar11) {
      local_300._4_4_ = iVar11;
      local_300._0_4_ = iVar11;
      local_300._8_4_ = iVar11;
      local_300._12_4_ = iVar11;
      local_300._16_4_ = iVar11;
      local_300._20_4_ = iVar11;
      local_300._24_4_ = iVar11;
      local_300._28_4_ = iVar11;
      local_320._4_4_ = fVar142;
      local_320._0_4_ = fVar142;
      fStack_318 = fVar142;
      fStack_314 = fVar142;
      fStack_310 = fVar142;
      fStack_30c = fVar142;
      fStack_308 = fVar142;
      fStack_304 = fVar142;
      local_500 = local_680._0_4_;
      uStack_4fc = local_680._0_4_;
      uStack_4f8 = local_680._0_4_;
      uStack_4f4 = local_680._0_4_;
      uStack_4f0 = local_680._0_4_;
      uStack_4ec = local_680._0_4_;
      uStack_4e8 = local_680._0_4_;
      uStack_4e4 = local_680._0_4_;
      local_100 = 1.0 / (float)local_460._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      local_290 = local_4c0._0_4_;
      uStack_28c = local_4c0._0_4_;
      uStack_288 = local_4c0._0_4_;
      uStack_284 = local_4c0._0_4_;
      local_2a0 = local_480._0_4_;
      uStack_29c = local_480._0_4_;
      uStack_298 = local_480._0_4_;
      uStack_294 = local_480._0_4_;
      local_6c0 = auVar229._0_32_;
      _local_6e0 = auVar226._0_32_;
      local_780 = auVar222;
      local_620 = auVar217;
      for (lVar90 = 8; local_660 = auVar140._0_32_, lVar90 < iVar11; lVar90 = lVar90 + 8) {
        auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar90 * 4 + lVar88);
        auVar110 = *(undefined1 (*) [32])(lVar88 + 0x21fb768 + lVar90 * 4);
        auVar8 = *(undefined1 (*) [32])(lVar88 + 0x21fbbec + lVar90 * 4);
        pauVar2 = (undefined1 (*) [32])(lVar88 + 0x21fc070 + lVar90 * 4);
        fVar119 = *(float *)*pauVar2;
        fVar207 = *(float *)(*pauVar2 + 4);
        fVar209 = *(float *)(*pauVar2 + 8);
        fVar211 = *(float *)(*pauVar2 + 0xc);
        fVar213 = *(float *)(*pauVar2 + 0x10);
        fVar70 = *(float *)(*pauVar2 + 0x14);
        fVar71 = *(float *)(*pauVar2 + 0x18);
        auVar82 = *(undefined1 (*) [28])*pauVar2;
        auVar227._0_4_ = fVar119 * local_600;
        auVar227._4_4_ = fVar207 * fStack_5fc;
        auVar227._8_4_ = fVar209 * fStack_5f8;
        auVar227._12_4_ = fVar211 * fStack_5f4;
        auVar227._16_4_ = fVar213 * fStack_5f0;
        auVar227._20_4_ = fVar70 * fStack_5ec;
        auVar227._28_36_ = auVar226._28_36_;
        auVar227._24_4_ = fVar71 * fStack_5e8;
        fVar198 = auVar204._0_4_;
        auVar226._0_4_ = fVar198 * fVar119;
        fVar205 = auVar204._4_4_;
        auVar226._4_4_ = fVar205 * fVar207;
        fVar206 = auVar204._8_4_;
        auVar226._8_4_ = fVar206 * fVar209;
        fVar208 = auVar204._12_4_;
        auVar226._12_4_ = fVar208 * fVar211;
        fVar210 = auVar204._16_4_;
        auVar226._16_4_ = fVar210 * fVar213;
        fVar212 = auVar204._20_4_;
        auVar226._20_4_ = fVar212 * fVar70;
        auVar226._28_36_ = auVar140._28_36_;
        fVar214 = auVar204._24_4_;
        auVar226._24_4_ = fVar214 * fVar71;
        auVar15 = vfmadd231ps_fma(auVar227._0_32_,auVar8,auVar164._0_32_);
        auVar161 = vfmadd231ps_fma(auVar226._0_32_,auVar8,auVar197._0_32_);
        auVar154 = auVar157._0_32_;
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar110,auVar154);
        auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar110,local_4a0);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar101,auVar235._0_32_);
        auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar101,local_440);
        auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar90 * 4 + lVar88);
        auVar155 = *(undefined1 (*) [32])(lVar88 + 0x21fdb88 + lVar90 * 4);
        auVar105 = *(undefined1 (*) [32])(lVar88 + 0x21fe00c + lVar90 * 4);
        pfVar3 = (float *)(lVar88 + 0x21fe490 + lVar90 * 4);
        fVar72 = *pfVar3;
        fVar73 = pfVar3[1];
        fVar74 = pfVar3[2];
        fVar75 = pfVar3[3];
        fVar76 = pfVar3[4];
        fVar77 = pfVar3[5];
        fVar78 = pfVar3[6];
        auVar230._0_4_ = local_600 * fVar72;
        auVar230._4_4_ = fStack_5fc * fVar73;
        auVar230._8_4_ = fStack_5f8 * fVar74;
        auVar230._12_4_ = fStack_5f4 * fVar75;
        auVar230._16_4_ = fStack_5f0 * fVar76;
        auVar230._20_4_ = fStack_5ec * fVar77;
        auVar230._28_36_ = auVar229._28_36_;
        auVar230._24_4_ = fStack_5e8 * fVar78;
        auVar229._0_4_ = fVar198 * fVar72;
        auVar229._4_4_ = fVar205 * fVar73;
        auVar229._8_4_ = fVar206 * fVar74;
        auVar229._12_4_ = fVar208 * fVar75;
        auVar229._16_4_ = fVar210 * fVar76;
        auVar229._20_4_ = fVar212 * fVar77;
        auVar229._28_36_ = auVar189._28_36_;
        auVar229._24_4_ = fVar214 * fVar78;
        auVar97 = vfmadd231ps_fma(auVar230._0_32_,auVar105,auVar164._0_32_);
        auVar96 = vfmadd231ps_fma(auVar229._0_32_,auVar105,auVar197._0_32_);
        auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar155,auVar154);
        auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar155,local_4a0);
        auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar107,auVar235._0_32_);
        auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar107,local_440);
        local_580 = ZEXT1632(auVar97);
        local_5a0 = ZEXT1632(auVar15);
        local_460 = vsubps_avx(local_580,local_5a0);
        auVar187 = ZEXT1632(auVar96);
        local_680 = ZEXT1632(auVar161);
        local_2c0 = vsubps_avx(auVar187,local_680);
        auVar39._4_4_ = auVar161._4_4_ * local_460._4_4_;
        auVar39._0_4_ = auVar161._0_4_ * local_460._0_4_;
        auVar39._8_4_ = auVar161._8_4_ * local_460._8_4_;
        auVar39._12_4_ = auVar161._12_4_ * local_460._12_4_;
        auVar39._16_4_ = local_460._16_4_ * 0.0;
        auVar39._20_4_ = local_460._20_4_ * 0.0;
        auVar39._24_4_ = local_460._24_4_ * 0.0;
        auVar39._28_4_ = local_440._28_4_;
        fVar142 = local_2c0._0_4_;
        auVar134._0_4_ = auVar15._0_4_ * fVar142;
        fVar141 = local_2c0._4_4_;
        auVar134._4_4_ = auVar15._4_4_ * fVar141;
        fVar112 = local_2c0._8_4_;
        auVar134._8_4_ = auVar15._8_4_ * fVar112;
        fVar114 = local_2c0._12_4_;
        auVar134._12_4_ = auVar15._12_4_ * fVar114;
        fVar116 = local_2c0._16_4_;
        auVar134._16_4_ = fVar116 * 0.0;
        fVar117 = local_2c0._20_4_;
        auVar134._20_4_ = fVar117 * 0.0;
        fVar118 = local_2c0._24_4_;
        auVar134._24_4_ = fVar118 * 0.0;
        auVar134._28_4_ = 0;
        auVar226 = ZEXT3264(auVar8);
        auVar106 = vsubps_avx(auVar39,auVar134);
        _local_2e0 = *pauVar2;
        auVar100 = _local_2e0;
        auVar40._4_4_ = local_e0._4_4_ * fVar207;
        auVar40._0_4_ = (float)local_e0 * fVar119;
        auVar40._8_4_ = (float)uStack_d8 * fVar209;
        auVar40._12_4_ = uStack_d8._4_4_ * fVar211;
        auVar40._16_4_ = (float)uStack_d0 * fVar213;
        auVar40._20_4_ = uStack_d0._4_4_ * fVar70;
        auVar40._24_4_ = (float)uStack_c8 * fVar71;
        auVar40._28_4_ = 0;
        auVar15 = vfmadd231ps_fma(auVar40,auVar8,local_c0);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_a0,auVar110);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_80,auVar101);
        auVar41._4_4_ = local_e0._4_4_ * fVar73;
        auVar41._0_4_ = (float)local_e0 * fVar72;
        auVar41._8_4_ = (float)uStack_d8 * fVar74;
        auVar41._12_4_ = uStack_d8._4_4_ * fVar75;
        auVar41._16_4_ = (float)uStack_d0 * fVar76;
        auVar41._20_4_ = uStack_d0._4_4_ * fVar77;
        auVar41._24_4_ = (float)uStack_c8 * fVar78;
        auVar41._28_4_ = uStack_c8._4_4_;
        auVar161 = vfmadd231ps_fma(auVar41,auVar105,local_c0);
        auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar155,local_a0);
        auVar189 = ZEXT3264(auVar107);
        auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar107,local_80);
        auVar229 = ZEXT1664(auVar161);
        auVar140._0_4_ = fVar142 * fVar142;
        auVar140._4_4_ = fVar141 * fVar141;
        auVar140._8_4_ = fVar112 * fVar112;
        auVar140._12_4_ = fVar114 * fVar114;
        auVar140._16_4_ = fVar116 * fVar116;
        auVar140._20_4_ = fVar117 * fVar117;
        auVar140._28_36_ = auVar204._28_36_;
        auVar140._24_4_ = fVar118 * fVar118;
        auVar97 = vfmadd231ps_fma(auVar140._0_32_,local_460,local_460);
        auVar135 = ZEXT1632(auVar15);
        auVar228 = ZEXT1632(auVar161);
        auVar131 = vmaxps_avx(auVar135,auVar228);
        auVar201._0_4_ = auVar131._0_4_ * auVar131._0_4_ * auVar97._0_4_;
        auVar201._4_4_ = auVar131._4_4_ * auVar131._4_4_ * auVar97._4_4_;
        auVar201._8_4_ = auVar131._8_4_ * auVar131._8_4_ * auVar97._8_4_;
        auVar201._12_4_ = auVar131._12_4_ * auVar131._12_4_ * auVar97._12_4_;
        auVar201._16_4_ = auVar131._16_4_ * auVar131._16_4_ * 0.0;
        auVar201._20_4_ = auVar131._20_4_ * auVar131._20_4_ * 0.0;
        auVar201._24_4_ = auVar131._24_4_ * auVar131._24_4_ * 0.0;
        auVar201._28_4_ = 0;
        auVar42._4_4_ = auVar106._4_4_ * auVar106._4_4_;
        auVar42._0_4_ = auVar106._0_4_ * auVar106._0_4_;
        auVar42._8_4_ = auVar106._8_4_ * auVar106._8_4_;
        auVar42._12_4_ = auVar106._12_4_ * auVar106._12_4_;
        auVar42._16_4_ = auVar106._16_4_ * auVar106._16_4_;
        auVar42._20_4_ = auVar106._20_4_ * auVar106._20_4_;
        auVar42._24_4_ = auVar106._24_4_ * auVar106._24_4_;
        auVar42._28_4_ = auVar106._28_4_;
        auVar131 = vcmpps_avx(auVar42,auVar201,2);
        local_200 = (int)lVar90;
        auVar202._4_4_ = local_200;
        auVar202._0_4_ = local_200;
        auVar202._8_4_ = local_200;
        auVar202._12_4_ = local_200;
        auVar202._16_4_ = local_200;
        auVar202._20_4_ = local_200;
        auVar202._24_4_ = local_200;
        auVar202._28_4_ = local_200;
        auVar106 = vpor_avx2(auVar202,_DAT_01fb4ba0);
        auVar20 = vpcmpgtd_avx2(local_300,auVar106);
        auVar106 = auVar20 & auVar131;
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar106 >> 0x7f,0) == '\0') &&
              (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0xbf,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar106[0x1f]) {
          auVar140 = ZEXT3264(local_660);
          auVar197 = ZEXT3264(local_720);
          auVar204 = ZEXT3264(auVar204._0_32_);
          auVar157 = ZEXT3264(auVar154);
          auVar235 = ZEXT3264(local_7a0);
        }
        else {
          local_480 = vandps_avx(auVar20,auVar131);
          auVar43._4_4_ = (float)local_6e0._4_4_ * fVar73;
          auVar43._0_4_ = (float)local_6e0._0_4_ * fVar72;
          auVar43._8_4_ = fStack_6d8 * fVar74;
          auVar43._12_4_ = fStack_6d4 * fVar75;
          auVar43._16_4_ = fStack_6d0 * fVar76;
          auVar43._20_4_ = fStack_6cc * fVar77;
          auVar43._24_4_ = fStack_6c8 * fVar78;
          auVar43._28_4_ = auVar131._28_4_;
          auVar15 = vfmadd213ps_fma(auVar105,local_620,auVar43);
          auVar15 = vfmadd213ps_fma(auVar155,local_6c0,ZEXT1632(auVar15));
          auVar15 = vfmadd213ps_fma(auVar107,local_780,ZEXT1632(auVar15));
          _local_5c0 = ZEXT1632(auVar15);
          local_2e0._0_4_ = auVar82._0_4_;
          local_2e0._4_4_ = auVar82._4_4_;
          fStack_2d8 = auVar82._8_4_;
          fStack_2d4 = auVar82._12_4_;
          fStack_2d0 = auVar82._16_4_;
          fStack_2cc = auVar82._20_4_;
          fStack_2c8 = auVar82._24_4_;
          auVar44._4_4_ = (float)local_6e0._4_4_ * (float)local_2e0._4_4_;
          auVar44._0_4_ = (float)local_6e0._0_4_ * (float)local_2e0._0_4_;
          auVar44._8_4_ = fStack_6d8 * fStack_2d8;
          auVar44._12_4_ = fStack_6d4 * fStack_2d4;
          auVar44._16_4_ = fStack_6d0 * fStack_2d0;
          auVar44._20_4_ = fStack_6cc * fStack_2cc;
          auVar44._24_4_ = fStack_6c8 * fStack_2c8;
          auVar44._28_4_ = auVar131._28_4_;
          auVar15 = vfmadd213ps_fma(auVar8,local_620,auVar44);
          auVar15 = vfmadd213ps_fma(auVar110,local_6c0,ZEXT1632(auVar15));
          auVar110 = *(undefined1 (*) [32])(lVar88 + 0x21fc4f4 + lVar90 * 4);
          auVar8 = *(undefined1 (*) [32])(lVar88 + 0x21fc978 + lVar90 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar88 + 0x21fcdfc + lVar90 * 4);
          pfVar4 = (float *)(lVar88 + 0x21fd280 + lVar90 * 4);
          fVar142 = *pfVar4;
          fVar141 = pfVar4[1];
          fVar112 = pfVar4[2];
          fVar114 = pfVar4[3];
          fVar116 = pfVar4[4];
          fVar117 = pfVar4[5];
          fVar118 = pfVar4[6];
          auVar45._4_4_ = fVar141 * fStack_5fc;
          auVar45._0_4_ = fVar142 * local_600;
          auVar45._8_4_ = fVar112 * fStack_5f8;
          auVar45._12_4_ = fVar114 * fStack_5f4;
          auVar45._16_4_ = fVar116 * fStack_5f0;
          auVar45._20_4_ = fVar117 * fStack_5ec;
          auVar45._24_4_ = fVar118 * fStack_5e8;
          auVar45._28_4_ = pfVar3[7];
          auVar224._0_4_ = fVar142 * fVar198;
          auVar224._4_4_ = fVar141 * fVar205;
          auVar224._8_4_ = fVar112 * fVar206;
          auVar224._12_4_ = fVar114 * fVar208;
          auVar224._16_4_ = fVar116 * fVar210;
          auVar224._20_4_ = fVar117 * fVar212;
          auVar224._24_4_ = fVar118 * fVar214;
          auVar224._28_4_ = 0;
          auVar46._4_4_ = (float)local_6e0._4_4_ * fVar141;
          auVar46._0_4_ = (float)local_6e0._0_4_ * fVar142;
          auVar46._8_4_ = fStack_6d8 * fVar112;
          auVar46._12_4_ = fStack_6d4 * fVar114;
          auVar46._16_4_ = fStack_6d0 * fVar116;
          auVar46._20_4_ = fStack_6cc * fVar117;
          auVar46._24_4_ = fStack_6c8 * fVar118;
          auVar46._28_4_ = pfVar4[7];
          auVar97 = vfmadd231ps_fma(auVar45,auVar107,local_560);
          auVar96 = vfmadd231ps_fma(auVar224,auVar107,local_720);
          auVar143 = vfmadd231ps_fma(auVar46,local_620,auVar107);
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar8,auVar154);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar8,local_4a0);
          auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),local_6c0,auVar8);
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar110,local_7a0);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar110,local_440);
          auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),local_780,auVar110);
          pfVar3 = (float *)(lVar88 + 0x21ff6a0 + lVar90 * 4);
          fVar142 = *pfVar3;
          fVar141 = pfVar3[1];
          fVar112 = pfVar3[2];
          fVar114 = pfVar3[3];
          fVar116 = pfVar3[4];
          fVar117 = pfVar3[5];
          fVar118 = pfVar3[6];
          auVar47._4_4_ = fStack_5fc * fVar141;
          auVar47._0_4_ = local_600 * fVar142;
          auVar47._8_4_ = fStack_5f8 * fVar112;
          auVar47._12_4_ = fStack_5f4 * fVar114;
          auVar47._16_4_ = fStack_5f0 * fVar116;
          auVar47._20_4_ = fStack_5ec * fVar117;
          auVar47._24_4_ = fStack_5e8 * fVar118;
          auVar47._28_4_ = local_620._28_4_;
          auVar48._4_4_ = fVar205 * fVar141;
          auVar48._0_4_ = fVar198 * fVar142;
          auVar48._8_4_ = fVar206 * fVar112;
          auVar48._12_4_ = fVar208 * fVar114;
          auVar48._16_4_ = fVar210 * fVar116;
          auVar48._20_4_ = fVar212 * fVar117;
          auVar48._24_4_ = fVar214 * fVar118;
          auVar48._28_4_ = auVar157._28_4_;
          auVar49._4_4_ = fVar141 * (float)local_6e0._4_4_;
          auVar49._0_4_ = fVar142 * (float)local_6e0._0_4_;
          auVar49._8_4_ = fVar112 * fStack_6d8;
          auVar49._12_4_ = fVar114 * fStack_6d4;
          auVar49._16_4_ = fVar116 * fStack_6d0;
          auVar49._20_4_ = fVar117 * fStack_6cc;
          auVar49._24_4_ = fVar118 * fStack_6c8;
          auVar49._28_4_ = pfVar3[7];
          auVar110 = *(undefined1 (*) [32])(lVar88 + 0x21ff21c + lVar90 * 4);
          auVar122 = vfmadd231ps_fma(auVar47,auVar110,local_560);
          auVar95 = vfmadd231ps_fma(auVar48,auVar110,local_720);
          auVar123 = vfmadd231ps_fma(auVar49,auVar110,local_620);
          auVar110 = *(undefined1 (*) [32])(lVar88 + 0x21fed98 + lVar90 * 4);
          auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar110,auVar154);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar110,local_4a0);
          auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar110,local_6c0);
          auVar110 = *(undefined1 (*) [32])(lVar88 + 0x21fe914 + lVar90 * 4);
          auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar110,local_7a0);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar110,local_440);
          auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),local_780,auVar110);
          auVar203._8_4_ = 0x7fffffff;
          auVar203._0_8_ = 0x7fffffff7fffffff;
          auVar203._12_4_ = 0x7fffffff;
          auVar203._16_4_ = 0x7fffffff;
          auVar203._20_4_ = 0x7fffffff;
          auVar203._24_4_ = 0x7fffffff;
          auVar203._28_4_ = 0x7fffffff;
          auVar110 = vandps_avx(ZEXT1632(auVar97),auVar203);
          auVar8 = vandps_avx(ZEXT1632(auVar96),auVar203);
          auVar8 = vmaxps_avx(auVar110,auVar8);
          auVar110 = vandps_avx(ZEXT1632(auVar143),auVar203);
          auVar110 = vmaxps_avx(auVar8,auVar110);
          auVar110 = vcmpps_avx(auVar110,_local_320,1);
          auVar107 = vblendvps_avx(ZEXT1632(auVar97),local_460,auVar110);
          auVar155 = vblendvps_avx(ZEXT1632(auVar96),local_2c0,auVar110);
          auVar110 = vandps_avx(ZEXT1632(auVar122),auVar203);
          auVar8 = vandps_avx(ZEXT1632(auVar95),auVar203);
          auVar8 = vmaxps_avx(auVar110,auVar8);
          auVar110 = vandps_avx(auVar203,ZEXT1632(auVar123));
          auVar110 = vmaxps_avx(auVar8,auVar110);
          auVar8 = vcmpps_avx(auVar110,_local_320,1);
          auVar110 = vblendvps_avx(ZEXT1632(auVar122),local_460,auVar8);
          auVar8 = vblendvps_avx(ZEXT1632(auVar95),local_2c0,auVar8);
          auVar15 = vfmadd213ps_fma(auVar101,local_780,ZEXT1632(auVar15));
          auVar97 = vfmadd213ps_fma(auVar107,auVar107,ZEXT832(0) << 0x20);
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar155,auVar155);
          auVar101 = vrsqrtps_avx(ZEXT1632(auVar97));
          fVar142 = auVar101._0_4_;
          fVar141 = auVar101._4_4_;
          fVar112 = auVar101._8_4_;
          fVar114 = auVar101._12_4_;
          fVar116 = auVar101._16_4_;
          fVar117 = auVar101._20_4_;
          fVar118 = auVar101._24_4_;
          auVar50._4_4_ = fVar141 * fVar141 * fVar141 * auVar97._4_4_ * -0.5;
          auVar50._0_4_ = fVar142 * fVar142 * fVar142 * auVar97._0_4_ * -0.5;
          auVar50._8_4_ = fVar112 * fVar112 * fVar112 * auVar97._8_4_ * -0.5;
          auVar50._12_4_ = fVar114 * fVar114 * fVar114 * auVar97._12_4_ * -0.5;
          auVar50._16_4_ = fVar116 * fVar116 * fVar116 * -0.0;
          auVar50._20_4_ = fVar117 * fVar117 * fVar117 * -0.0;
          auVar50._24_4_ = fVar118 * fVar118 * fVar118 * -0.0;
          auVar50._28_4_ = 0;
          auVar234._8_4_ = 0x3fc00000;
          auVar234._0_8_ = 0x3fc000003fc00000;
          auVar234._12_4_ = 0x3fc00000;
          auVar234._16_4_ = 0x3fc00000;
          auVar234._20_4_ = 0x3fc00000;
          auVar234._24_4_ = 0x3fc00000;
          auVar234._28_4_ = 0x3fc00000;
          auVar97 = vfmadd231ps_fma(auVar50,auVar234,auVar101);
          fVar142 = auVar97._0_4_;
          fVar141 = auVar97._4_4_;
          auVar51._4_4_ = auVar155._4_4_ * fVar141;
          auVar51._0_4_ = auVar155._0_4_ * fVar142;
          fVar112 = auVar97._8_4_;
          auVar51._8_4_ = auVar155._8_4_ * fVar112;
          fVar114 = auVar97._12_4_;
          auVar51._12_4_ = auVar155._12_4_ * fVar114;
          auVar51._16_4_ = auVar155._16_4_ * 0.0;
          auVar51._20_4_ = auVar155._20_4_ * 0.0;
          auVar51._24_4_ = auVar155._24_4_ * 0.0;
          auVar51._28_4_ = auVar101._28_4_;
          auVar52._4_4_ = fVar141 * -auVar107._4_4_;
          auVar52._0_4_ = fVar142 * -auVar107._0_4_;
          auVar52._8_4_ = fVar112 * -auVar107._8_4_;
          auVar52._12_4_ = fVar114 * -auVar107._12_4_;
          auVar52._16_4_ = -auVar107._16_4_ * 0.0;
          auVar52._20_4_ = -auVar107._20_4_ * 0.0;
          auVar52._24_4_ = -auVar107._24_4_ * 0.0;
          auVar52._28_4_ = auVar155._28_4_;
          auVar97 = vfmadd213ps_fma(auVar110,auVar110,ZEXT832(0) << 0x20);
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar8,auVar8);
          auVar101 = vrsqrtps_avx(ZEXT1632(auVar97));
          auVar53._28_4_ = auVar157._28_4_;
          auVar53._0_28_ =
               ZEXT1628(CONCAT412(fVar114 * 0.0,
                                  CONCAT48(fVar112 * 0.0,CONCAT44(fVar141 * 0.0,fVar142 * 0.0))));
          fVar142 = auVar101._0_4_;
          fVar141 = auVar101._4_4_;
          fVar112 = auVar101._8_4_;
          fVar114 = auVar101._12_4_;
          fVar116 = auVar101._16_4_;
          fVar117 = auVar101._20_4_;
          fVar118 = auVar101._24_4_;
          auVar54._4_4_ = fVar141 * fVar141 * fVar141 * auVar97._4_4_ * -0.5;
          auVar54._0_4_ = fVar142 * fVar142 * fVar142 * auVar97._0_4_ * -0.5;
          auVar54._8_4_ = fVar112 * fVar112 * fVar112 * auVar97._8_4_ * -0.5;
          auVar54._12_4_ = fVar114 * fVar114 * fVar114 * auVar97._12_4_ * -0.5;
          auVar54._16_4_ = fVar116 * fVar116 * fVar116 * -0.0;
          auVar54._20_4_ = fVar117 * fVar117 * fVar117 * -0.0;
          auVar54._24_4_ = fVar118 * fVar118 * fVar118 * -0.0;
          auVar54._28_4_ = 0;
          auVar97 = vfmadd231ps_fma(auVar54,auVar234,auVar101);
          fVar142 = auVar97._0_4_;
          fVar141 = auVar97._4_4_;
          auVar55._4_4_ = auVar8._4_4_ * fVar141;
          auVar55._0_4_ = auVar8._0_4_ * fVar142;
          fVar112 = auVar97._8_4_;
          auVar55._8_4_ = auVar8._8_4_ * fVar112;
          fVar114 = auVar97._12_4_;
          auVar55._12_4_ = auVar8._12_4_ * fVar114;
          auVar55._16_4_ = auVar8._16_4_ * 0.0;
          auVar55._20_4_ = auVar8._20_4_ * 0.0;
          auVar55._24_4_ = auVar8._24_4_ * 0.0;
          auVar55._28_4_ = 0;
          auVar56._4_4_ = fVar141 * -auVar110._4_4_;
          auVar56._0_4_ = fVar142 * -auVar110._0_4_;
          auVar56._8_4_ = fVar112 * -auVar110._8_4_;
          auVar56._12_4_ = fVar114 * -auVar110._12_4_;
          auVar56._16_4_ = -auVar110._16_4_ * 0.0;
          auVar56._20_4_ = -auVar110._20_4_ * 0.0;
          auVar56._24_4_ = -auVar110._24_4_ * 0.0;
          auVar56._28_4_ = auVar101._28_4_;
          auVar57._28_4_ = 0xbf000000;
          auVar57._0_28_ =
               ZEXT1628(CONCAT412(fVar114 * 0.0,
                                  CONCAT48(fVar112 * 0.0,CONCAT44(fVar141 * 0.0,fVar142 * 0.0))));
          auVar97 = vfmadd213ps_fma(auVar51,auVar135,local_5a0);
          auVar96 = vfmadd213ps_fma(auVar52,auVar135,local_680);
          auVar143 = vfmadd213ps_fma(auVar53,auVar135,ZEXT1632(auVar15));
          auVar166 = vfnmadd213ps_fma(auVar51,auVar135,local_5a0);
          auVar122 = vfmadd213ps_fma(auVar55,auVar228,local_580);
          auVar94 = vfnmadd213ps_fma(auVar52,auVar135,local_680);
          auVar95 = vfmadd213ps_fma(auVar56,auVar228,auVar187);
          auVar15 = vfnmadd231ps_fma(ZEXT1632(auVar15),auVar135,auVar53);
          auVar123 = vfmadd213ps_fma(auVar57,auVar228,_local_5c0);
          auVar121 = vfnmadd213ps_fma(auVar55,auVar228,local_580);
          auVar165 = vfnmadd213ps_fma(auVar56,auVar228,auVar187);
          auVar172 = vfnmadd231ps_fma(_local_5c0,auVar228,auVar57);
          auVar101 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar94));
          auVar110 = vsubps_avx(ZEXT1632(auVar123),ZEXT1632(auVar15));
          auVar58._4_4_ = auVar101._4_4_ * auVar15._4_4_;
          auVar58._0_4_ = auVar101._0_4_ * auVar15._0_4_;
          auVar58._8_4_ = auVar101._8_4_ * auVar15._8_4_;
          auVar58._12_4_ = auVar101._12_4_ * auVar15._12_4_;
          auVar58._16_4_ = auVar101._16_4_ * 0.0;
          auVar58._20_4_ = auVar101._20_4_ * 0.0;
          auVar58._24_4_ = auVar101._24_4_ * 0.0;
          auVar58._28_4_ = 0;
          auVar158 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar94),auVar110);
          auVar59._4_4_ = auVar166._4_4_ * auVar110._4_4_;
          auVar59._0_4_ = auVar166._0_4_ * auVar110._0_4_;
          auVar59._8_4_ = auVar166._8_4_ * auVar110._8_4_;
          auVar59._12_4_ = auVar166._12_4_ * auVar110._12_4_;
          auVar59._16_4_ = auVar110._16_4_ * 0.0;
          auVar59._20_4_ = auVar110._20_4_ * 0.0;
          auVar59._24_4_ = auVar110._24_4_ * 0.0;
          auVar59._28_4_ = auVar110._28_4_;
          auVar105 = ZEXT1632(auVar166);
          auVar110 = vsubps_avx(ZEXT1632(auVar122),auVar105);
          auVar106 = ZEXT1632(auVar15);
          auVar15 = vfmsub231ps_fma(auVar59,auVar106,auVar110);
          auVar60._4_4_ = auVar94._4_4_ * auVar110._4_4_;
          auVar60._0_4_ = auVar94._0_4_ * auVar110._0_4_;
          auVar60._8_4_ = auVar94._8_4_ * auVar110._8_4_;
          auVar60._12_4_ = auVar94._12_4_ * auVar110._12_4_;
          auVar60._16_4_ = auVar110._16_4_ * 0.0;
          auVar60._20_4_ = auVar110._20_4_ * 0.0;
          auVar60._24_4_ = auVar110._24_4_ * 0.0;
          auVar60._28_4_ = auVar110._28_4_;
          auVar166 = vfmsub231ps_fma(auVar60,auVar105,auVar101);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar166),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar158));
          auVar20 = vcmpps_avx(ZEXT1632(auVar15),ZEXT832(0) << 0x20,2);
          auVar101 = vblendvps_avx(ZEXT1632(auVar121),ZEXT1632(auVar97),auVar20);
          auVar110 = vblendvps_avx(ZEXT1632(auVar165),ZEXT1632(auVar96),auVar20);
          local_680 = vblendvps_avx(ZEXT1632(auVar172),ZEXT1632(auVar143),auVar20);
          auVar8 = vblendvps_avx(auVar105,ZEXT1632(auVar122),auVar20);
          auVar107 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar95),auVar20);
          auVar155 = vblendvps_avx(auVar106,ZEXT1632(auVar123),auVar20);
          auVar105 = vblendvps_avx(ZEXT1632(auVar122),auVar105,auVar20);
          auVar131 = vblendvps_avx(ZEXT1632(auVar95),ZEXT1632(auVar94),auVar20);
          auVar15 = vpackssdw_avx(local_480._0_16_,local_480._16_16_);
          auVar106 = vblendvps_avx(ZEXT1632(auVar123),auVar106,auVar20);
          auVar105 = vsubps_avx(auVar105,auVar101);
          auVar131 = vsubps_avx(auVar131,auVar110);
          auVar154 = vsubps_avx(auVar106,local_680);
          auVar226 = ZEXT3264(auVar154);
          auVar187 = vsubps_avx(auVar101,auVar8);
          auVar99 = vsubps_avx(auVar110,auVar107);
          auVar126 = vsubps_avx(local_680,auVar155);
          auVar229 = ZEXT3264(auVar126);
          auVar180._0_4_ = auVar154._0_4_ * auVar101._0_4_;
          auVar180._4_4_ = auVar154._4_4_ * auVar101._4_4_;
          auVar180._8_4_ = auVar154._8_4_ * auVar101._8_4_;
          auVar180._12_4_ = auVar154._12_4_ * auVar101._12_4_;
          auVar180._16_4_ = auVar154._16_4_ * auVar101._16_4_;
          auVar180._20_4_ = auVar154._20_4_ * auVar101._20_4_;
          auVar180._24_4_ = auVar154._24_4_ * auVar101._24_4_;
          auVar180._28_4_ = 0;
          auVar97 = vfmsub231ps_fma(auVar180,local_680,auVar105);
          auVar61._4_4_ = auVar105._4_4_ * auVar110._4_4_;
          auVar61._0_4_ = auVar105._0_4_ * auVar110._0_4_;
          auVar61._8_4_ = auVar105._8_4_ * auVar110._8_4_;
          auVar61._12_4_ = auVar105._12_4_ * auVar110._12_4_;
          auVar61._16_4_ = auVar105._16_4_ * auVar110._16_4_;
          auVar61._20_4_ = auVar105._20_4_ * auVar110._20_4_;
          auVar61._24_4_ = auVar105._24_4_ * auVar110._24_4_;
          auVar61._28_4_ = auVar106._28_4_;
          auVar96 = vfmsub231ps_fma(auVar61,auVar101,auVar131);
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT832(0) << 0x20,ZEXT1632(auVar97));
          auVar181._0_4_ = auVar131._0_4_ * local_680._0_4_;
          auVar181._4_4_ = auVar131._4_4_ * local_680._4_4_;
          auVar181._8_4_ = auVar131._8_4_ * local_680._8_4_;
          auVar181._12_4_ = auVar131._12_4_ * local_680._12_4_;
          auVar181._16_4_ = auVar131._16_4_ * local_680._16_4_;
          auVar181._20_4_ = auVar131._20_4_ * local_680._20_4_;
          auVar181._24_4_ = auVar131._24_4_ * local_680._24_4_;
          auVar181._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar181,auVar110,auVar154);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar97),ZEXT832(0) << 0x20,ZEXT1632(auVar96));
          auVar182._0_4_ = auVar126._0_4_ * auVar8._0_4_;
          auVar182._4_4_ = auVar126._4_4_ * auVar8._4_4_;
          auVar182._8_4_ = auVar126._8_4_ * auVar8._8_4_;
          auVar182._12_4_ = auVar126._12_4_ * auVar8._12_4_;
          auVar182._16_4_ = auVar126._16_4_ * auVar8._16_4_;
          auVar182._20_4_ = auVar126._20_4_ * auVar8._20_4_;
          auVar182._24_4_ = auVar126._24_4_ * auVar8._24_4_;
          auVar182._28_4_ = 0;
          auVar97 = vfmsub231ps_fma(auVar182,auVar187,auVar155);
          auVar62._4_4_ = auVar99._4_4_ * auVar155._4_4_;
          auVar62._0_4_ = auVar99._0_4_ * auVar155._0_4_;
          auVar62._8_4_ = auVar99._8_4_ * auVar155._8_4_;
          auVar62._12_4_ = auVar99._12_4_ * auVar155._12_4_;
          auVar62._16_4_ = auVar99._16_4_ * auVar155._16_4_;
          auVar62._20_4_ = auVar99._20_4_ * auVar155._20_4_;
          auVar62._24_4_ = auVar99._24_4_ * auVar155._24_4_;
          auVar62._28_4_ = auVar101._28_4_;
          auVar143 = vfmsub231ps_fma(auVar62,auVar107,auVar126);
          auVar63._4_4_ = auVar187._4_4_ * auVar107._4_4_;
          auVar63._0_4_ = auVar187._0_4_ * auVar107._0_4_;
          auVar63._8_4_ = auVar187._8_4_ * auVar107._8_4_;
          auVar63._12_4_ = auVar187._12_4_ * auVar107._12_4_;
          auVar63._16_4_ = auVar187._16_4_ * auVar107._16_4_;
          auVar63._20_4_ = auVar187._20_4_ * auVar107._20_4_;
          auVar63._24_4_ = auVar187._24_4_ * auVar107._24_4_;
          auVar63._28_4_ = auVar107._28_4_;
          auVar122 = vfmsub231ps_fma(auVar63,auVar99,auVar8);
          auVar107 = ZEXT832(0) << 0x20;
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar107,ZEXT1632(auVar97));
          auVar143 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar107,ZEXT1632(auVar143));
          auVar8 = vmaxps_avx(ZEXT1632(auVar96),ZEXT1632(auVar143));
          auVar8 = vcmpps_avx(auVar8,auVar107,2);
          auVar122 = auVar8._16_16_;
          auVar97 = vpackssdw_avx(auVar8._0_16_,auVar122);
          auVar15 = vpand_avx(auVar97,auVar15);
          auVar8 = vpmovsxwd_avx2(auVar15);
          if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar8 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar8 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar8 >> 0x7f,0) == '\0') &&
                (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar8 >> 0xbf,0) == '\0') &&
              (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar8[0x1f]) {
LAB_010fc738:
            auVar163._8_8_ = local_540[1]._8_8_;
            auVar163._0_8_ = local_540[1]._0_8_;
            auVar163._16_8_ = local_540[1]._16_8_;
            auVar163._24_8_ = local_540[1]._24_8_;
            auVar189 = ZEXT1664(auVar122);
          }
          else {
            auVar64._4_4_ = auVar131._4_4_ * auVar126._4_4_;
            auVar64._0_4_ = auVar131._0_4_ * auVar126._0_4_;
            auVar64._8_4_ = auVar131._8_4_ * auVar126._8_4_;
            auVar64._12_4_ = auVar131._12_4_ * auVar126._12_4_;
            auVar64._16_4_ = auVar131._16_4_ * auVar126._16_4_;
            auVar64._20_4_ = auVar131._20_4_ * auVar126._20_4_;
            auVar64._24_4_ = auVar131._24_4_ * auVar126._24_4_;
            auVar64._28_4_ = auVar8._28_4_;
            auVar123 = vfmsub231ps_fma(auVar64,auVar99,auVar154);
            auVar188._0_4_ = auVar154._0_4_ * auVar187._0_4_;
            auVar188._4_4_ = auVar154._4_4_ * auVar187._4_4_;
            auVar188._8_4_ = auVar154._8_4_ * auVar187._8_4_;
            auVar188._12_4_ = auVar154._12_4_ * auVar187._12_4_;
            auVar188._16_4_ = auVar154._16_4_ * auVar187._16_4_;
            auVar188._20_4_ = auVar154._20_4_ * auVar187._20_4_;
            auVar188._24_4_ = auVar154._24_4_ * auVar187._24_4_;
            auVar188._28_4_ = 0;
            auVar122 = vfmsub231ps_fma(auVar188,auVar105,auVar126);
            auVar65._4_4_ = auVar105._4_4_ * auVar99._4_4_;
            auVar65._0_4_ = auVar105._0_4_ * auVar99._0_4_;
            auVar65._8_4_ = auVar105._8_4_ * auVar99._8_4_;
            auVar65._12_4_ = auVar105._12_4_ * auVar99._12_4_;
            auVar65._16_4_ = auVar105._16_4_ * auVar99._16_4_;
            auVar65._20_4_ = auVar105._20_4_ * auVar99._20_4_;
            auVar65._24_4_ = auVar105._24_4_ * auVar99._24_4_;
            auVar65._28_4_ = auVar99._28_4_;
            auVar158 = vfmsub231ps_fma(auVar65,auVar187,auVar131);
            auVar97 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar122),ZEXT1632(auVar158));
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar97),ZEXT1632(auVar123),auVar107);
            auVar8 = vrcpps_avx(ZEXT1632(auVar95));
            auVar225._8_4_ = 0x3f800000;
            auVar225._0_8_ = 0x3f8000003f800000;
            auVar225._12_4_ = 0x3f800000;
            auVar225._16_4_ = 0x3f800000;
            auVar225._20_4_ = 0x3f800000;
            auVar225._24_4_ = 0x3f800000;
            auVar225._28_4_ = 0x3f800000;
            auVar226 = ZEXT3264(auVar225);
            auVar97 = vfnmadd213ps_fma(auVar8,ZEXT1632(auVar95),auVar225);
            auVar97 = vfmadd132ps_fma(ZEXT1632(auVar97),auVar8,auVar8);
            auVar66._4_4_ = auVar158._4_4_ * local_680._4_4_;
            auVar66._0_4_ = auVar158._0_4_ * local_680._0_4_;
            auVar66._8_4_ = auVar158._8_4_ * local_680._8_4_;
            auVar66._12_4_ = auVar158._12_4_ * local_680._12_4_;
            auVar66._16_4_ = local_680._16_4_ * 0.0;
            auVar66._20_4_ = local_680._20_4_ * 0.0;
            auVar66._24_4_ = local_680._24_4_ * 0.0;
            auVar66._28_4_ = auVar110._28_4_;
            auVar122 = vfmadd231ps_fma(auVar66,ZEXT1632(auVar122),auVar110);
            auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),ZEXT1632(auVar123),auVar101);
            fVar142 = auVar97._0_4_;
            fVar141 = auVar97._4_4_;
            fVar112 = auVar97._8_4_;
            fVar114 = auVar97._12_4_;
            auVar107 = ZEXT1632(CONCAT412(fVar114 * auVar122._12_4_,
                                          CONCAT48(fVar112 * auVar122._8_4_,
                                                   CONCAT44(fVar141 * auVar122._4_4_,
                                                            fVar142 * auVar122._0_4_))));
            uVar91 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar162._4_4_ = uVar91;
            auVar162._0_4_ = uVar91;
            auVar162._8_4_ = uVar91;
            auVar162._12_4_ = uVar91;
            auVar162._16_4_ = uVar91;
            auVar162._20_4_ = uVar91;
            auVar162._24_4_ = uVar91;
            auVar162._28_4_ = uVar91;
            auVar81._4_4_ = uStack_4fc;
            auVar81._0_4_ = local_500;
            auVar81._8_4_ = uStack_4f8;
            auVar81._12_4_ = uStack_4f4;
            auVar81._16_4_ = uStack_4f0;
            auVar81._20_4_ = uStack_4ec;
            auVar81._24_4_ = uStack_4e8;
            auVar81._28_4_ = uStack_4e4;
            auVar101 = vcmpps_avx(auVar81,auVar107,2);
            auVar8 = vcmpps_avx(auVar107,auVar162,2);
            auVar101 = vandps_avx(auVar8,auVar101);
            auVar97 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
            auVar15 = vpand_avx(auVar15,auVar97);
            auVar101 = vpmovsxwd_avx2(auVar15);
            auVar122 = ZEXT816(0) << 0x20;
            if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar101 >> 0x7f,0) == '\0') &&
                  (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar101 >> 0xbf,0) == '\0') &&
                (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar101[0x1f]) goto LAB_010fc738;
            auVar101 = vcmpps_avx(ZEXT1632(auVar95),ZEXT832(0) << 0x20,4);
            auVar97 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
            auVar15 = vpand_avx(auVar15,auVar97);
            auVar101 = vpmovsxwd_avx2(auVar15);
            auVar189 = ZEXT3264(auVar101);
            auVar163._8_8_ = local_540[1]._8_8_;
            auVar163._0_8_ = local_540[1]._0_8_;
            auVar163._16_8_ = local_540[1]._16_8_;
            auVar163._24_8_ = local_540[1]._24_8_;
            if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar101 >> 0x7f,0) != '\0') ||
                  (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar101 >> 0xbf,0) != '\0') ||
                (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar101[0x1f] < '\0') {
              auVar155 = ZEXT1632(CONCAT412(fVar114 * auVar96._12_4_,
                                            CONCAT48(fVar112 * auVar96._8_4_,
                                                     CONCAT44(fVar141 * auVar96._4_4_,
                                                              fVar142 * auVar96._0_4_))));
              auVar67._28_4_ = SUB84(local_540[1]._24_8_,4);
              auVar67._0_28_ =
                   ZEXT1628(CONCAT412(fVar114 * auVar143._12_4_,
                                      CONCAT48(fVar112 * auVar143._8_4_,
                                               CONCAT44(fVar141 * auVar143._4_4_,
                                                        fVar142 * auVar143._0_4_))));
              auVar196._8_4_ = 0x3f800000;
              auVar196._0_8_ = 0x3f8000003f800000;
              auVar196._12_4_ = 0x3f800000;
              auVar196._16_4_ = 0x3f800000;
              auVar196._20_4_ = 0x3f800000;
              auVar196._24_4_ = 0x3f800000;
              auVar196._28_4_ = 0x3f800000;
              auVar8 = vsubps_avx(auVar196,auVar155);
              local_660 = vblendvps_avx(auVar8,auVar155,auVar20);
              auVar8 = vsubps_avx(auVar196,auVar67);
              local_380 = vblendvps_avx(auVar8,auVar67,auVar20);
              local_360 = auVar107;
              auVar163 = auVar101;
            }
          }
          auVar235 = ZEXT3264(local_7a0);
          auVar204 = ZEXT3264(CONCAT428(fStack_624,
                                        CONCAT424(fStack_628,
                                                  CONCAT420(fStack_62c,
                                                            CONCAT416(fStack_630,
                                                                      CONCAT412(fStack_634,
                                                                                CONCAT48(fStack_638,
                                                                                         CONCAT44(
                                                  fStack_63c,local_640))))))));
          local_4c0 = auVar135;
          if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar163 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar163 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar163 >> 0x7f,0) == '\0') &&
                (auVar163 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar163 >> 0xbf,0) == '\0') &&
              (auVar163 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar163[0x1f]) {
            auVar140 = ZEXT3264(local_660);
            auVar157 = ZEXT3264(local_5e0);
            auVar197 = ZEXT3264(local_720);
          }
          else {
            auVar101 = vsubps_avx(auVar228,auVar135);
            auVar15 = vfmadd213ps_fma(auVar101,local_660,auVar135);
            fVar142 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            auVar68._4_4_ = (auVar15._4_4_ + auVar15._4_4_) * fVar142;
            auVar68._0_4_ = (auVar15._0_4_ + auVar15._0_4_) * fVar142;
            auVar68._8_4_ = (auVar15._8_4_ + auVar15._8_4_) * fVar142;
            auVar68._12_4_ = (auVar15._12_4_ + auVar15._12_4_) * fVar142;
            auVar68._16_4_ = fVar142 * 0.0;
            auVar68._20_4_ = fVar142 * 0.0;
            auVar68._24_4_ = fVar142 * 0.0;
            auVar68._28_4_ = fVar142;
            auVar101 = vcmpps_avx(local_360,auVar68,6);
            auVar8 = auVar163 & auVar101;
            auVar157 = ZEXT3264(local_5e0);
            auVar197 = ZEXT3264(local_720);
            if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar8 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar8 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar8 >> 0x7f,0) == '\0') &&
                  (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar8 >> 0xbf,0) == '\0') &&
                (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar8[0x1f]) {
              auVar140 = ZEXT3264(local_660);
            }
            else {
              auVar136._8_4_ = 0xbf800000;
              auVar136._0_8_ = 0xbf800000bf800000;
              auVar136._12_4_ = 0xbf800000;
              auVar136._16_4_ = 0xbf800000;
              auVar136._20_4_ = 0xbf800000;
              auVar136._24_4_ = 0xbf800000;
              auVar136._28_4_ = 0xbf800000;
              auVar156._8_4_ = 0x40000000;
              auVar156._0_8_ = 0x4000000040000000;
              auVar156._12_4_ = 0x40000000;
              auVar156._16_4_ = 0x40000000;
              auVar156._20_4_ = 0x40000000;
              auVar156._24_4_ = 0x40000000;
              auVar156._28_4_ = 0x40000000;
              auVar15 = vfmadd213ps_fma(local_380,auVar156,auVar136);
              auVar189 = ZEXT1664(auVar15);
              local_260 = local_660;
              local_380 = ZEXT1632(auVar15);
              auVar8 = local_380;
              local_240 = ZEXT1632(auVar15);
              local_220 = local_360;
              local_1fc = iVar11;
              local_1f0 = uVar79;
              uStack_1e8 = uVar80;
              local_1e0 = local_7c0;
              uStack_1d8 = uStack_7b8;
              local_1d0 = local_7d0;
              uStack_1c8 = uStack_7c8;
              local_1c0 = local_7e0;
              uStack_1b8 = uStack_7d8;
              pGVar12 = (context->scene->geometries).items[uVar10].ptr;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                local_540[0] = vandps_avx(auVar101,auVar163);
                fVar142 = (float)local_200;
                local_180[0] = (fVar142 + local_660._0_4_ + 0.0) * local_100;
                local_180[1] = (fVar142 + local_660._4_4_ + 1.0) * fStack_fc;
                local_180[2] = (fVar142 + local_660._8_4_ + 2.0) * fStack_f8;
                local_180[3] = (fVar142 + local_660._12_4_ + 3.0) * fStack_f4;
                fStack_170 = (fVar142 + local_660._16_4_ + 4.0) * fStack_f0;
                fStack_16c = (fVar142 + local_660._20_4_ + 5.0) * fStack_ec;
                fStack_168 = (fVar142 + local_660._24_4_ + 6.0) * fStack_e8;
                fStack_164 = fVar142 + local_660._28_4_ + 7.0;
                local_380._0_8_ = auVar15._0_8_;
                local_380._8_8_ = auVar15._8_8_;
                local_160 = local_380._0_8_;
                uStack_158 = local_380._8_8_;
                uStack_150 = 0;
                uStack_148 = 0;
                local_140 = local_360;
                auVar137._8_4_ = 0x7f800000;
                auVar137._0_8_ = 0x7f8000007f800000;
                auVar137._12_4_ = 0x7f800000;
                auVar137._16_4_ = 0x7f800000;
                auVar137._20_4_ = 0x7f800000;
                auVar137._24_4_ = 0x7f800000;
                auVar137._28_4_ = 0x7f800000;
                auVar101 = vblendvps_avx(auVar137,local_360,local_540[0]);
                auVar107 = vshufps_avx(auVar101,auVar101,0xb1);
                auVar107 = vminps_avx(auVar101,auVar107);
                auVar155 = vshufpd_avx(auVar107,auVar107,5);
                auVar107 = vminps_avx(auVar107,auVar155);
                auVar155 = vpermpd_avx2(auVar107,0x4e);
                auVar107 = vminps_avx(auVar107,auVar155);
                auVar107 = vcmpps_avx(auVar101,auVar107,0);
                auVar155 = local_540[0] & auVar107;
                auVar101 = local_540[0];
                if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar155 >> 0x7f,0) != '\0') ||
                      (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar155 >> 0xbf,0) != '\0') ||
                    (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar155[0x1f] < '\0') {
                  auVar101 = vandps_avx(auVar107,local_540[0]);
                }
                local_680._0_8_ = lVar90;
                uVar85 = vmovmskps_avx(auVar101);
                uVar5 = 0;
                for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                  uVar5 = uVar5 + 1;
                }
                uVar86 = (ulong)uVar5;
                local_380 = auVar8;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar142 = local_180[uVar86];
                  uVar91 = *(undefined4 *)((long)&local_160 + uVar86 * 4);
                  fVar112 = 1.0 - fVar142;
                  fVar141 = fVar112 * fVar112 * -3.0;
                  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar112 * fVar112)),
                                            ZEXT416((uint)(fVar142 * fVar112)),ZEXT416(0xc0000000));
                  auVar161 = vfmsub132ss_fma(ZEXT416((uint)(fVar142 * fVar112)),
                                             ZEXT416((uint)(fVar142 * fVar142)),ZEXT416(0x40000000))
                  ;
                  auVar189 = ZEXT464(0x40400000);
                  fVar112 = auVar15._0_4_ * 3.0;
                  fVar114 = auVar161._0_4_ * 3.0;
                  fVar116 = fVar142 * fVar142 * 3.0;
                  auVar176._0_4_ = fVar116 * fVar111;
                  auVar176._4_4_ = fVar116 * fVar113;
                  auVar176._8_4_ = fVar116 * fVar115;
                  auVar176._12_4_ = fVar116 * fVar69;
                  auVar146._4_4_ = fVar114;
                  auVar146._0_4_ = fVar114;
                  auVar146._8_4_ = fVar114;
                  auVar146._12_4_ = fVar114;
                  auVar15 = vfmadd132ps_fma(auVar146,auVar176,auVar19);
                  auVar160._4_4_ = fVar112;
                  auVar160._0_4_ = fVar112;
                  auVar160._8_4_ = fVar112;
                  auVar160._12_4_ = fVar112;
                  auVar15 = vfmadd132ps_fma(auVar160,auVar15,auVar18);
                  auVar147._4_4_ = fVar141;
                  auVar147._0_4_ = fVar141;
                  auVar147._8_4_ = fVar141;
                  auVar147._12_4_ = fVar141;
                  auVar15 = vfmadd132ps_fma(auVar147,auVar15,auVar16);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + uVar86 * 4);
                  *(int *)(ray + k * 4 + 0xc0) = auVar15._0_4_;
                  uVar220 = vextractps_avx(auVar15,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar220;
                  uVar220 = vextractps_avx(auVar15,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar220;
                  *(float *)(ray + k * 4 + 0xf0) = fVar142;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar91;
                  *(uint *)(ray + k * 4 + 0x110) = uVar84;
                  *(uint *)(ray + k * 4 + 0x120) = uVar10;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_700 = ZEXT1632(CONCAT88(auVar161._8_8_,local_700._0_8_));
                  auVar15 = *local_688;
                  auStack_870 = auVar110._16_16_;
                  local_880 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  _local_2e0 = auVar100;
                  while( true ) {
                    auVar101 = _local_880;
                    local_3e0 = local_180[uVar86];
                    local_3d0 = *(undefined4 *)((long)&local_160 + uVar86 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + uVar86 * 4);
                    fVar112 = 1.0 - local_3e0;
                    auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar112 * fVar112)),
                                              ZEXT416((uint)(local_3e0 * fVar112)),
                                              ZEXT416(0xc0000000));
                    auVar161 = vfmsub132ss_fma(ZEXT416((uint)(local_3e0 * fVar112)),
                                               ZEXT416((uint)(local_3e0 * local_3e0)),
                                               ZEXT416(0x40000000));
                    auVar189 = ZEXT464(0x40400000);
                    fVar142 = auVar161._0_4_ * 3.0;
                    fVar141 = local_3e0 * local_3e0 * 3.0;
                    auVar177._0_4_ = fVar141 * fVar111;
                    auVar177._4_4_ = fVar141 * fVar113;
                    auVar177._8_4_ = fVar141 * fVar115;
                    auVar177._12_4_ = fVar141 * fVar69;
                    auVar148._4_4_ = fVar142;
                    auVar148._0_4_ = fVar142;
                    auVar148._8_4_ = fVar142;
                    auVar148._12_4_ = fVar142;
                    auVar161 = vfmadd132ps_fma(auVar148,auVar177,auVar19);
                    fVar142 = auVar97._0_4_ * 3.0;
                    auVar168._4_4_ = fVar142;
                    auVar168._0_4_ = fVar142;
                    auVar168._8_4_ = fVar142;
                    auVar168._12_4_ = fVar142;
                    auVar161 = vfmadd132ps_fma(auVar168,auVar161,auVar18);
                    fVar142 = fVar112 * fVar112 * -3.0;
                    local_750.context = context->user;
                    auVar149._4_4_ = fVar142;
                    auVar149._0_4_ = fVar142;
                    auVar149._8_4_ = fVar142;
                    auVar149._12_4_ = fVar142;
                    auVar97 = vfmadd132ps_fma(auVar149,auVar161,auVar17);
                    local_410 = auVar97._0_4_;
                    uStack_40c = local_410;
                    uStack_408 = local_410;
                    uStack_404 = local_410;
                    auVar161 = vshufps_avx(auVar97,auVar97,0x55);
                    local_400 = auVar161;
                    local_3f0 = vshufps_avx(auVar97,auVar97,0xaa);
                    fStack_3dc = local_3e0;
                    fStack_3d8 = local_3e0;
                    fStack_3d4 = local_3e0;
                    uStack_3cc = local_3d0;
                    uStack_3c8 = local_3d0;
                    uStack_3c4 = local_3d0;
                    local_3c0 = CONCAT44(uStack_29c,local_2a0);
                    uStack_3b8 = CONCAT44(uStack_294,uStack_298);
                    local_3b0._4_4_ = uStack_28c;
                    local_3b0._0_4_ = local_290;
                    local_3b0._8_4_ = uStack_288;
                    local_3b0._12_4_ = uStack_284;
                    vpcmpeqd_avx2(ZEXT1632(local_3b0),ZEXT1632(local_3b0));
                    uStack_39c = (local_750.context)->instID[0];
                    local_3a0 = uStack_39c;
                    uStack_398 = uStack_39c;
                    uStack_394 = uStack_39c;
                    uStack_390 = (local_750.context)->instPrimID[0];
                    uStack_38c = uStack_390;
                    uStack_388 = uStack_390;
                    uStack_384 = uStack_390;
                    local_750.valid = (int *)local_7b0;
                    local_750.geometryUserPtr = pGVar12->userPtr;
                    local_750.hit = (RTCHitN *)&local_410;
                    local_750.N = 4;
                    local_7b0 = auVar15;
                    local_750.ray = (RTCRayN *)ray;
                    if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar189 = ZEXT1664(auVar189._0_16_);
                      auVar226 = ZEXT1664(auVar226._0_16_);
                      auVar229 = ZEXT1664(auVar229._0_16_);
                      (*pGVar12->intersectionFilterN)(&local_750);
                    }
                    if (local_7b0 == (undefined1  [16])0x0) {
                      auVar161 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar97 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                      auVar161 = auVar161 ^ auVar97;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      auVar97 = vpcmpeqd_avx(auVar161,auVar161);
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar189 = ZEXT1664(auVar189._0_16_);
                        auVar226 = ZEXT1664(auVar226._0_16_);
                        auVar229 = ZEXT1664(auVar229._0_16_);
                        (*p_Var13)(&local_750);
                        auVar97 = vpcmpeqd_avx(auVar97,auVar97);
                      }
                      auVar96 = vpcmpeqd_avx(local_7b0,_DAT_01f45a50);
                      auVar161 = auVar96 ^ auVar97;
                      if (local_7b0 != (undefined1  [16])0x0) {
                        auVar96 = auVar96 ^ auVar97;
                        auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])local_750.hit);
                        *(undefined1 (*) [16])(local_750.ray + 0xc0) = auVar97;
                        auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x10));
                        *(undefined1 (*) [16])(local_750.ray + 0xd0) = auVar97;
                        auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x20));
                        *(undefined1 (*) [16])(local_750.ray + 0xe0) = auVar97;
                        auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x30));
                        *(undefined1 (*) [16])(local_750.ray + 0xf0) = auVar97;
                        auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x40));
                        *(undefined1 (*) [16])(local_750.ray + 0x100) = auVar97;
                        auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x50));
                        *(undefined1 (*) [16])(local_750.ray + 0x110) = auVar97;
                        auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x60));
                        *(undefined1 (*) [16])(local_750.ray + 0x120) = auVar97;
                        auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x70));
                        *(undefined1 (*) [16])(local_750.ray + 0x130) = auVar97;
                        auVar97 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x80));
                        *(undefined1 (*) [16])(local_750.ray + 0x140) = auVar97;
                      }
                    }
                    auVar110 = local_360;
                    auVar124._8_8_ = 0x100000001;
                    auVar124._0_8_ = 0x100000001;
                    if ((auVar124 & auVar161) == (undefined1  [16])0x0) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_880._0_4_;
                    }
                    else {
                      local_880._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_880._4_4_ = 0;
                      local_880._8_4_ = 0;
                      local_880._12_4_ = 0;
                    }
                    *(undefined4 *)(local_540[0] + uVar86 * 4) = 0;
                    auStack_870 = auVar101._16_16_;
                    auVar108._4_4_ = local_880._0_4_;
                    auVar108._0_4_ = local_880._0_4_;
                    auVar108._8_4_ = local_880._0_4_;
                    auVar108._12_4_ = local_880._0_4_;
                    auVar108._16_4_ = local_880._0_4_;
                    auVar108._20_4_ = local_880._0_4_;
                    auVar108._24_4_ = local_880._0_4_;
                    auVar108._28_4_ = local_880._0_4_;
                    auVar8 = vcmpps_avx(auVar110,auVar108,2);
                    auVar101 = vandps_avx(auVar8,local_540[0]);
                    local_540[0] = local_540[0] & auVar8;
                    if ((((((((local_540[0] >> 0x1f & (undefined1  [32])0x1) ==
                              (undefined1  [32])0x0 &&
                             (local_540[0] >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_540[0] >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_540[0] >> 0x7f,0) == '\0')
                          && (local_540[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                          ) && SUB321(local_540[0] >> 0xbf,0) == '\0') &&
                        (local_540[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_540[0][0x1f]) break;
                    auVar138._8_4_ = 0x7f800000;
                    auVar138._0_8_ = 0x7f8000007f800000;
                    auVar138._12_4_ = 0x7f800000;
                    auVar138._16_4_ = 0x7f800000;
                    auVar138._20_4_ = 0x7f800000;
                    auVar138._24_4_ = 0x7f800000;
                    auVar138._28_4_ = 0x7f800000;
                    auVar110 = vblendvps_avx(auVar138,auVar110,auVar101);
                    auVar8 = vshufps_avx(auVar110,auVar110,0xb1);
                    auVar8 = vminps_avx(auVar110,auVar8);
                    auVar107 = vshufpd_avx(auVar8,auVar8,5);
                    auVar8 = vminps_avx(auVar8,auVar107);
                    auVar107 = vpermpd_avx2(auVar8,0x4e);
                    auVar8 = vminps_avx(auVar8,auVar107);
                    auVar8 = vcmpps_avx(auVar110,auVar8,0);
                    auVar107 = auVar101 & auVar8;
                    auVar110 = auVar101;
                    if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar107 >> 0x7f,0) != '\0') ||
                          (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar107 >> 0xbf,0) != '\0') ||
                        (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar107[0x1f] < '\0') {
                      auVar110 = vandps_avx(auVar8,auVar101);
                    }
                    uVar85 = vmovmskps_avx(auVar110);
                    uVar5 = 0;
                    for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                      uVar5 = uVar5 + 1;
                    }
                    uVar86 = (ulong)uVar5;
                    local_540[0] = auVar101;
                  }
                  auVar197 = ZEXT3264(local_720);
                  auVar204 = ZEXT3264(CONCAT428(fStack_624,
                                                CONCAT424(fStack_628,
                                                          CONCAT420(fStack_62c,
                                                                    CONCAT416(fStack_630,
                                                                              CONCAT412(fStack_634,
                                                                                        CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
                  auVar235 = ZEXT3264(local_7a0);
                }
                lVar90 = local_680._0_8_;
              }
              auVar140 = ZEXT3264(local_660);
              auVar157 = ZEXT3264(local_5e0);
            }
          }
        }
        auVar164 = ZEXT3264(local_560);
      }
    }
    uVar91 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar98._4_4_ = uVar91;
    auVar98._0_4_ = uVar91;
    auVar98._8_4_ = uVar91;
    auVar98._12_4_ = uVar91;
    auVar15 = vcmpps_avx(local_280,auVar98,2);
    uVar84 = vmovmskps_avx(auVar15);
    uVar92 = (ulong)((uint)uVar92 & uVar84);
    pPVar89 = (Primitive *)local_700._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }